

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::UnaryOp_x86_avx::forward_inplace(UnaryOp_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  float *pfVar20;
  undefined1 (*pauVar21) [32];
  long lVar22;
  int iVar23;
  int iVar24;
  ulong uVar25;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar26;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  float fVar105;
  float fVar106;
  float fVar107;
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar63 [32];
  undefined1 auVar103 [56];
  undefined1 auVar64 [64];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar49 [32];
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd_01;
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dd_02;
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar54 [32];
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dd_03;
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dd_04;
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar36 [16];
  float fVar101;
  float fVar102;
  float fVar104;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dd_05;
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dd_06;
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar60 [32];
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Dc_07;
  undefined4 extraout_XMM0_Dd_07;
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Dc_08;
  undefined4 extraout_XMM0_Dd_08;
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined4 extraout_XMM0_Db_09;
  undefined4 extraout_XMM0_Dc_09;
  undefined4 extraout_XMM0_Dd_09;
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined4 extraout_XMM0_Db_10;
  undefined4 extraout_XMM0_Dc_10;
  undefined4 extraout_XMM0_Dd_10;
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar108 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar121 [16];
  undefined1 auVar138 [32];
  undefined1 auVar140 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar159 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar160 [64];
  float fVar161;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  float fVar174;
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  float fVar172;
  float fVar173;
  float fVar175;
  float fVar176;
  float fVar177;
  undefined1 in_ZMM3 [64];
  float fVar178;
  float fVar196;
  float fVar197;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  float fVar198;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  float fVar199;
  float fVar200;
  float fVar201;
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  float fVar202;
  undefined1 auVar203 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  float fVar215;
  undefined1 auVar204 [16];
  float fVar219;
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  float fVar213;
  float fVar214;
  float fVar216;
  float fVar217;
  float fVar218;
  undefined1 in_ZMM5 [64];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 in_ZMM6 [64];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 in_ZMM7 [64];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 in_ZMM8 [64];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [32];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 in_ZMM11 [64];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [32];
  __m128 afVar321;
  unary_op_tan op;
  __m256 _p;
  unary_op_tan local_161;
  undefined1 local_160 [16];
  undefined1 local_150 [16];
  long local_138;
  undefined8 local_130;
  Mat *local_128;
  undefined1 local_120 [32];
  undefined1 local_f0 [16];
  undefined1 local_e0 [16];
  undefined1 local_d0 [16];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  long local_60;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  undefined1 extraout_var_04 [60];
  undefined1 extraout_var_05 [60];
  undefined1 extraout_var_06 [60];
  undefined1 extraout_var_07 [60];
  undefined1 extraout_var_08 [60];
  undefined1 extraout_var_09 [60];
  undefined1 extraout_var_10 [60];
  undefined1 extraout_var_11 [60];
  undefined1 extraout_var_12 [60];
  undefined1 extraout_var_13 [60];
  undefined1 extraout_var_14 [60];
  undefined1 extraout_var_15 [60];
  undefined1 extraout_var_16 [60];
  undefined1 extraout_var_17 [60];
  undefined1 extraout_var_18 [60];
  undefined1 extraout_var_19 [60];
  undefined1 extraout_var_20 [60];
  undefined1 extraout_var_21 [60];
  undefined1 extraout_var_22 [60];
  undefined1 extraout_var_23 [60];
  undefined1 extraout_var_24 [60];
  undefined1 extraout_var_25 [60];
  undefined1 extraout_var_26 [60];
  undefined1 extraout_var_27 [60];
  undefined1 extraout_var_28 [60];
  undefined1 extraout_var_29 [60];
  undefined1 extraout_var_30 [60];
  undefined1 extraout_var_31 [60];
  undefined1 extraout_var_32 [60];
  undefined1 extraout_var_33 [60];
  undefined1 extraout_var_34 [60];
  undefined1 auVar135 [32];
  undefined1 auVar139 [32];
  
  auVar57 = _DAT_00594ae0;
  auVar133 = _DAT_00594ac0;
  auVar110 = in_ZMM3._0_16_;
  auVar141 = in_ZMM5._0_16_;
  local_128 = bottom_top_blob;
  switch(*(undefined4 *)(&this->field_0xd0 + (long)this->_vptr_UnaryOp_x86_avx[-3])) {
  case 0:
    iVar23 = bottom_top_blob->c;
    if (0 < (long)iVar23) {
      uVar15 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar22 = 0;
      auVar47._8_4_ = 0x7fffffff;
      auVar47._0_8_ = 0x7fffffff7fffffff;
      auVar47._12_4_ = 0x7fffffff;
      auVar47._16_4_ = 0x7fffffff;
      auVar47._20_4_ = 0x7fffffff;
      auVar47._24_4_ = 0x7fffffff;
      auVar47._28_4_ = 0x7fffffff;
      auVar108._8_4_ = 0x7fffffff;
      auVar108._0_8_ = 0x7fffffff7fffffff;
      auVar108._12_4_ = 0x7fffffff;
      auVar179._8_8_ = 0x8000000000000000;
      auVar179._0_8_ = 0x8000000000000000;
      auVar110 = vpcmpeqd_avx(auVar141,auVar141);
      do {
        pauVar21 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar22 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar15 < 8) {
          uVar18 = 0;
        }
        else {
          iVar24 = 7;
          do {
            auVar56 = vandps_avx(auVar47,*pauVar21);
            *pauVar21 = auVar56;
            pauVar21 = pauVar21 + 1;
            iVar24 = iVar24 + 8;
            uVar18 = uVar15 & 0xfffffff8;
          } while (iVar24 < (int)uVar15);
        }
        uVar17 = uVar18 | 3;
        while ((int)uVar17 < (int)uVar15) {
          auVar141 = vandps_avx(auVar108,*(undefined1 (*) [16])*pauVar21);
          *(undefined1 (*) [16])*pauVar21 = auVar141;
          pauVar21 = (undefined1 (*) [32])(*pauVar21 + 0x10);
          uVar17 = uVar18 + 7;
          uVar18 = uVar18 + 4;
        }
        if ((int)uVar18 < (int)uVar15) {
          uVar16 = CONCAT44(0,~uVar18 + uVar15);
          auVar220._8_8_ = 0;
          auVar220._0_8_ = uVar16;
          auVar204 = vpshufd_avx(auVar220,0x44);
          auVar141 = vorps_avx(auVar204,auVar179);
          auVar130 = vorps_avx(auVar204,auVar179);
          auVar204 = vorps_avx(auVar204,auVar179);
          uVar25 = 0;
          do {
            auVar259._8_8_ = 0;
            auVar259._0_8_ = uVar25;
            auVar295 = vpshufd_avx(auVar259,0x44);
            auVar277._16_16_ = auVar295;
            auVar277._0_16_ = auVar295;
            auVar56 = vorps_avx(auVar277,auVar133);
            auVar156 = vorps_avx(auVar277,auVar57);
            auVar303._0_8_ = auVar156._16_8_ ^ 0x8000000000000000;
            auVar303._8_4_ = auVar156._24_4_;
            auVar303._12_4_ = auVar156._28_4_ ^ 0x80000000;
            auVar295 = vpcmpgtq_avx(auVar303,auVar141);
            auVar260._0_8_ = auVar156._0_8_ ^ 0x8000000000000000;
            auVar260._8_4_ = auVar156._8_4_;
            auVar260._12_4_ = auVar156._12_4_ ^ 0x80000000;
            auVar36 = vpcmpgtq_avx(auVar260,auVar130);
            auVar295 = vpackssdw_avx(auVar36,auVar295);
            auVar304._0_8_ = auVar56._16_8_ ^ 0x8000000000000000;
            auVar304._8_4_ = auVar56._24_4_;
            auVar304._12_4_ = auVar56._28_4_ ^ 0x80000000;
            auVar36 = vpcmpgtq_avx(auVar304,auVar141);
            auVar289._0_8_ = auVar56._0_8_ ^ 0x8000000000000000;
            auVar289._8_4_ = auVar56._8_4_;
            auVar289._12_4_ = auVar56._12_4_ ^ 0x80000000;
            auVar126 = vpcmpgtq_avx(auVar289,auVar204);
            auVar36 = vpackssdw_avx(auVar126,auVar36);
            auVar295 = vpackssdw_avx(auVar36 ^ auVar110,auVar295 ^ auVar110);
            auVar36 = vpmovsxwd_avx(auVar295);
            auVar295 = vpunpckhwd_avx(auVar295,auVar295);
            auVar278._16_16_ = auVar295;
            auVar278._0_16_ = auVar36;
            auVar56 = vmaskmovps_avx(auVar278,*(undefined1 (*) [32])(*pauVar21 + uVar25 * 4));
            auVar56 = vandps_avx(auVar56,auVar47);
            auVar56 = vmaskmovps_avx(auVar278,auVar56);
            *(undefined1 (*) [32])(*pauVar21 + uVar25 * 4) = auVar56;
            uVar25 = uVar25 + 8;
          } while ((uVar16 + 8 & 0x1fffffff8) != uVar25);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != iVar23);
    }
    break;
  case 1:
    iVar23 = bottom_top_blob->c;
    if (0 < (long)iVar23) {
      uVar15 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar22 = 0;
      auVar189._8_8_ = 0x8000000000000000;
      auVar189._0_8_ = 0x8000000000000000;
      auVar110 = vpcmpeqd_avx(auVar141,auVar141);
      do {
        pauVar21 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar22 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar15 < 8) {
          uVar18 = 0;
        }
        else {
          iVar24 = 7;
          do {
            auVar56 = *pauVar21;
            auVar230._0_8_ = auVar56._0_8_ ^ 0x8000000080000000;
            auVar230._8_4_ = auVar56._8_4_ ^ 0x80000000;
            auVar230._12_4_ = auVar56._12_4_ ^ 0x80000000;
            auVar230._16_4_ = auVar56._16_4_ ^ 0x80000000;
            auVar230._20_4_ = auVar56._20_4_ ^ 0x80000000;
            auVar230._24_4_ = auVar56._24_4_ ^ 0x80000000;
            auVar230._28_4_ = auVar56._28_4_ ^ 0x80000000;
            *pauVar21 = auVar230;
            pauVar21 = pauVar21 + 1;
            iVar24 = iVar24 + 8;
            uVar18 = uVar15 & 0xfffffff8;
          } while (iVar24 < (int)uVar15);
        }
        uVar17 = uVar18 | 3;
        while ((int)uVar17 < (int)uVar15) {
          auVar141 = *(undefined1 (*) [16])*pauVar21;
          auVar225._0_8_ = auVar141._0_8_ ^ 0x8000000080000000;
          auVar225._8_4_ = auVar141._8_4_ ^ 0x80000000;
          auVar225._12_4_ = auVar141._12_4_ ^ 0x80000000;
          *(undefined1 (*) [16])*pauVar21 = auVar225;
          pauVar21 = (undefined1 (*) [32])(*pauVar21 + 0x10);
          uVar17 = uVar18 + 7;
          uVar18 = uVar18 + 4;
        }
        if ((int)uVar18 < (int)uVar15) {
          uVar16 = CONCAT44(0,~uVar18 + uVar15);
          auVar226._8_8_ = 0;
          auVar226._0_8_ = uVar16;
          auVar204 = vpshufd_avx(auVar226,0x44);
          auVar141 = vorps_avx(auVar204,auVar189);
          auVar130 = vorps_avx(auVar204,auVar189);
          auVar204 = vorps_avx(auVar204,auVar189);
          uVar25 = 0;
          do {
            auVar271._8_8_ = 0;
            auVar271._0_8_ = uVar25;
            auVar295 = vpshufd_avx(auVar271,0x44);
            auVar284._16_16_ = auVar295;
            auVar284._0_16_ = auVar295;
            auVar56 = vorps_avx(auVar284,auVar133);
            auVar156 = vorps_avx(auVar284,auVar57);
            auVar307._0_8_ = auVar156._16_8_ ^ 0x8000000000000000;
            auVar307._8_4_ = auVar156._24_4_;
            auVar307._12_4_ = auVar156._28_4_ ^ 0x80000000;
            auVar295 = vpcmpgtq_avx(auVar307,auVar141);
            auVar272._0_8_ = auVar156._0_8_ ^ 0x8000000000000000;
            auVar272._8_4_ = auVar156._8_4_;
            auVar272._12_4_ = auVar156._12_4_ ^ 0x80000000;
            auVar36 = vpcmpgtq_avx(auVar272,auVar130);
            auVar295 = vpackssdw_avx(auVar36,auVar295);
            auVar308._0_8_ = auVar56._16_8_ ^ 0x8000000000000000;
            auVar308._8_4_ = auVar56._24_4_;
            auVar308._12_4_ = auVar56._28_4_ ^ 0x80000000;
            auVar36 = vpcmpgtq_avx(auVar308,auVar141);
            auVar294._0_8_ = auVar56._0_8_ ^ 0x8000000000000000;
            auVar294._8_4_ = auVar56._8_4_;
            auVar294._12_4_ = auVar56._12_4_ ^ 0x80000000;
            auVar126 = vpcmpgtq_avx(auVar294,auVar204);
            auVar36 = vpackssdw_avx(auVar126,auVar36);
            auVar295 = vpackssdw_avx(auVar36 ^ auVar110,auVar295 ^ auVar110);
            auVar36 = vpmovsxwd_avx(auVar295);
            auVar295 = vpunpckhwd_avx(auVar295,auVar295);
            auVar285._16_16_ = auVar295;
            auVar285._0_16_ = auVar36;
            auVar56 = vmaskmovps_avx(auVar285,*(undefined1 (*) [32])(*pauVar21 + uVar25 * 4));
            auVar302._0_8_ = auVar56._0_8_ ^ 0x8000000080000000;
            auVar302._8_4_ = auVar56._8_4_ ^ 0x80000000;
            auVar302._12_4_ = auVar56._12_4_ ^ 0x80000000;
            auVar302._16_4_ = auVar56._16_4_ ^ 0x80000000;
            auVar302._20_4_ = auVar56._20_4_ ^ 0x80000000;
            auVar302._24_4_ = auVar56._24_4_ ^ 0x80000000;
            auVar302._28_4_ = auVar56._28_4_ ^ 0x80000000;
            auVar56 = vmaskmovps_avx(auVar285,auVar302);
            *(undefined1 (*) [32])(*pauVar21 + uVar25 * 4) = auVar56;
            uVar25 = uVar25 + 8;
          } while ((uVar16 + 8 & 0x1fffffff8) != uVar25);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != iVar23);
    }
    break;
  case 2:
    iVar23 = bottom_top_blob->c;
    if (0 < (long)iVar23) {
      uVar15 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar22 = 0;
      auVar148._8_8_ = 0x8000000000000000;
      auVar148._0_8_ = 0x8000000000000000;
      auVar110 = vpcmpeqd_avx(auVar110,auVar110);
      do {
        pauVar21 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar22 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar15 < 8) {
          uVar18 = 0;
        }
        else {
          iVar24 = 7;
          do {
            auVar56 = vroundps_avx(*pauVar21,1);
            *pauVar21 = auVar56;
            pauVar21 = pauVar21 + 1;
            iVar24 = iVar24 + 8;
            uVar18 = uVar15 & 0xfffffff8;
          } while (iVar24 < (int)uVar15);
        }
        uVar17 = uVar18 | 3;
        while ((int)uVar17 < (int)uVar15) {
          auVar141 = vroundps_avx(*(undefined1 (*) [16])*pauVar21,1);
          *(undefined1 (*) [16])*pauVar21 = auVar141;
          pauVar21 = (undefined1 (*) [32])(*pauVar21 + 0x10);
          uVar17 = uVar18 + 7;
          uVar18 = uVar18 + 4;
        }
        if ((int)uVar18 < (int)uVar15) {
          uVar16 = CONCAT44(0,~uVar18 + uVar15);
          auVar185._8_8_ = 0;
          auVar185._0_8_ = uVar16;
          auVar204 = vpshufd_avx(auVar185,0x44);
          auVar141 = vorps_avx(auVar204,auVar148);
          auVar130 = vorps_avx(auVar204,auVar148);
          auVar204 = vorps_avx(auVar204,auVar148);
          uVar25 = 0;
          do {
            auVar234._8_8_ = 0;
            auVar234._0_8_ = uVar25;
            auVar295 = vpshufd_avx(auVar234,0x44);
            auVar243._16_16_ = auVar295;
            auVar243._0_16_ = auVar295;
            auVar56 = vorps_avx(auVar243,auVar133);
            auVar156 = vorps_avx(auVar243,auVar57);
            auVar265._0_8_ = auVar156._16_8_ ^ 0x8000000000000000;
            auVar265._8_4_ = auVar156._24_4_;
            auVar265._12_4_ = auVar156._28_4_ ^ 0x80000000;
            auVar295 = vpcmpgtq_avx(auVar265,auVar141);
            auVar235._0_8_ = auVar156._0_8_ ^ 0x8000000000000000;
            auVar235._8_4_ = auVar156._8_4_;
            auVar235._12_4_ = auVar156._12_4_ ^ 0x80000000;
            auVar36 = vpcmpgtq_avx(auVar235,auVar130);
            auVar295 = vpackssdw_avx(auVar36,auVar295);
            auVar266._0_8_ = auVar56._16_8_ ^ 0x8000000000000000;
            auVar266._8_4_ = auVar56._24_4_;
            auVar266._12_4_ = auVar56._28_4_ ^ 0x80000000;
            auVar36 = vpcmpgtq_avx(auVar266,auVar141);
            auVar250._0_8_ = auVar56._0_8_ ^ 0x8000000000000000;
            auVar250._8_4_ = auVar56._8_4_;
            auVar250._12_4_ = auVar56._12_4_ ^ 0x80000000;
            auVar126 = vpcmpgtq_avx(auVar250,auVar204);
            auVar36 = vpackssdw_avx(auVar126,auVar36);
            auVar295 = vpackssdw_avx(auVar36 ^ auVar110,auVar295 ^ auVar110);
            auVar36 = vpmovsxwd_avx(auVar295);
            auVar295 = vpunpckhwd_avx(auVar295,auVar295);
            auVar244._16_16_ = auVar295;
            auVar244._0_16_ = auVar36;
            auVar56 = vmaskmovps_avx(auVar244,*(undefined1 (*) [32])(*pauVar21 + uVar25 * 4));
            auVar56 = vroundps_avx(auVar56,9);
            auVar56 = vmaskmovps_avx(auVar244,auVar56);
            *(undefined1 (*) [32])(*pauVar21 + uVar25 * 4) = auVar56;
            uVar25 = uVar25 + 8;
          } while ((uVar16 + 8 & 0x1fffffff8) != uVar25);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != iVar23);
    }
    break;
  case 3:
    iVar23 = bottom_top_blob->c;
    if (0 < (long)iVar23) {
      uVar15 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar22 = 0;
      auVar149._8_8_ = 0x8000000000000000;
      auVar149._0_8_ = 0x8000000000000000;
      auVar110 = vpcmpeqd_avx(auVar110,auVar110);
      do {
        pauVar21 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar22 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar15 < 8) {
          uVar18 = 0;
        }
        else {
          iVar24 = 7;
          do {
            auVar56 = vroundps_avx(*pauVar21,2);
            *pauVar21 = auVar56;
            pauVar21 = pauVar21 + 1;
            iVar24 = iVar24 + 8;
            uVar18 = uVar15 & 0xfffffff8;
          } while (iVar24 < (int)uVar15);
        }
        uVar17 = uVar18 | 3;
        while ((int)uVar17 < (int)uVar15) {
          auVar141 = vroundps_avx(*(undefined1 (*) [16])*pauVar21,2);
          *(undefined1 (*) [16])*pauVar21 = auVar141;
          pauVar21 = (undefined1 (*) [32])(*pauVar21 + 0x10);
          uVar17 = uVar18 + 7;
          uVar18 = uVar18 + 4;
        }
        if ((int)uVar18 < (int)uVar15) {
          uVar16 = CONCAT44(0,~uVar18 + uVar15);
          auVar187._8_8_ = 0;
          auVar187._0_8_ = uVar16;
          auVar204 = vpshufd_avx(auVar187,0x44);
          auVar141 = vorps_avx(auVar204,auVar149);
          auVar130 = vorps_avx(auVar204,auVar149);
          auVar204 = vorps_avx(auVar204,auVar149);
          uVar25 = 0;
          do {
            auVar236._8_8_ = 0;
            auVar236._0_8_ = uVar25;
            auVar295 = vpshufd_avx(auVar236,0x44);
            auVar245._16_16_ = auVar295;
            auVar245._0_16_ = auVar295;
            auVar56 = vorps_avx(auVar245,auVar133);
            auVar156 = vorps_avx(auVar245,auVar57);
            auVar269._0_8_ = auVar156._16_8_ ^ 0x8000000000000000;
            auVar269._8_4_ = auVar156._24_4_;
            auVar269._12_4_ = auVar156._28_4_ ^ 0x80000000;
            auVar295 = vpcmpgtq_avx(auVar269,auVar141);
            auVar237._0_8_ = auVar156._0_8_ ^ 0x8000000000000000;
            auVar237._8_4_ = auVar156._8_4_;
            auVar237._12_4_ = auVar156._12_4_ ^ 0x80000000;
            auVar36 = vpcmpgtq_avx(auVar237,auVar130);
            auVar295 = vpackssdw_avx(auVar36,auVar295);
            auVar270._0_8_ = auVar56._16_8_ ^ 0x8000000000000000;
            auVar270._8_4_ = auVar56._24_4_;
            auVar270._12_4_ = auVar56._28_4_ ^ 0x80000000;
            auVar36 = vpcmpgtq_avx(auVar270,auVar141);
            auVar251._0_8_ = auVar56._0_8_ ^ 0x8000000000000000;
            auVar251._8_4_ = auVar56._8_4_;
            auVar251._12_4_ = auVar56._12_4_ ^ 0x80000000;
            auVar126 = vpcmpgtq_avx(auVar251,auVar204);
            auVar36 = vpackssdw_avx(auVar126,auVar36);
            auVar295 = vpackssdw_avx(auVar36 ^ auVar110,auVar295 ^ auVar110);
            auVar36 = vpmovsxwd_avx(auVar295);
            auVar295 = vpunpckhwd_avx(auVar295,auVar295);
            auVar246._16_16_ = auVar295;
            auVar246._0_16_ = auVar36;
            auVar56 = vmaskmovps_avx(auVar246,*(undefined1 (*) [32])(*pauVar21 + uVar25 * 4));
            auVar56 = vroundps_avx(auVar56,10);
            auVar56 = vmaskmovps_avx(auVar246,auVar56);
            *(undefined1 (*) [32])(*pauVar21 + uVar25 * 4) = auVar56;
            uVar25 = uVar25 + 8;
          } while ((uVar16 + 8 & 0x1fffffff8) != uVar25);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != iVar23);
    }
    break;
  case 4:
    iVar23 = bottom_top_blob->c;
    if (0 < (long)iVar23) {
      uVar15 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar22 = 0;
      auVar144._8_8_ = 0x8000000000000000;
      auVar144._0_8_ = 0x8000000000000000;
      auVar110 = vpcmpeqd_avx(auVar110,auVar110);
      do {
        pauVar21 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar22 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar15 < 8) {
          uVar18 = 0;
        }
        else {
          iVar24 = 7;
          do {
            auVar3._4_4_ = *(float *)(*pauVar21 + 4) * *(float *)(*pauVar21 + 4);
            auVar3._0_4_ = *(float *)*pauVar21 * *(float *)*pauVar21;
            auVar3._8_4_ = *(float *)(*pauVar21 + 8) * *(float *)(*pauVar21 + 8);
            auVar3._12_4_ = *(float *)(*pauVar21 + 0xc) * *(float *)(*pauVar21 + 0xc);
            auVar3._16_4_ = *(float *)(*pauVar21 + 0x10) * *(float *)(*pauVar21 + 0x10);
            auVar3._20_4_ = *(float *)(*pauVar21 + 0x14) * *(float *)(*pauVar21 + 0x14);
            auVar3._24_4_ = *(float *)(*pauVar21 + 0x18) * *(float *)(*pauVar21 + 0x18);
            auVar3._28_4_ = *(undefined4 *)(*pauVar21 + 0x1c);
            *pauVar21 = auVar3;
            pauVar21 = pauVar21 + 1;
            iVar24 = iVar24 + 8;
            uVar18 = uVar15 & 0xfffffff8;
          } while (iVar24 < (int)uVar15);
        }
        uVar17 = uVar18 | 3;
        while ((int)uVar17 < (int)uVar15) {
          auVar181._0_4_ = *(float *)*pauVar21 * *(float *)*pauVar21;
          auVar181._4_4_ = *(float *)(*pauVar21 + 4) * *(float *)(*pauVar21 + 4);
          auVar181._8_4_ = *(float *)(*pauVar21 + 8) * *(float *)(*pauVar21 + 8);
          auVar181._12_4_ = *(float *)(*pauVar21 + 0xc) * *(float *)(*pauVar21 + 0xc);
          *(undefined1 (*) [16])*pauVar21 = auVar181;
          pauVar21 = (undefined1 (*) [32])(*pauVar21 + 0x10);
          uVar17 = uVar18 + 7;
          uVar18 = uVar18 + 4;
        }
        if ((int)uVar18 < (int)uVar15) {
          uVar16 = CONCAT44(0,~uVar18 + uVar15);
          auVar182._8_8_ = 0;
          auVar182._0_8_ = uVar16;
          auVar204 = vpshufd_avx(auVar182,0x44);
          auVar141 = vorps_avx(auVar204,auVar144);
          auVar130 = vorps_avx(auVar204,auVar144);
          auVar204 = vorps_avx(auVar204,auVar144);
          uVar25 = 0;
          do {
            auVar232._8_8_ = 0;
            auVar232._0_8_ = uVar25;
            auVar295 = vpshufd_avx(auVar232,0x44);
            auVar240._16_16_ = auVar295;
            auVar240._0_16_ = auVar295;
            auVar56 = vorps_avx(auVar240,auVar133);
            auVar156 = vorps_avx(auVar240,auVar57);
            auVar262._0_8_ = auVar156._16_8_ ^ 0x8000000000000000;
            auVar262._8_4_ = auVar156._24_4_;
            auVar262._12_4_ = auVar156._28_4_ ^ 0x80000000;
            auVar295 = vpcmpgtq_avx(auVar262,auVar141);
            auVar233._0_8_ = auVar156._0_8_ ^ 0x8000000000000000;
            auVar233._8_4_ = auVar156._8_4_;
            auVar233._12_4_ = auVar156._12_4_ ^ 0x80000000;
            auVar36 = vpcmpgtq_avx(auVar233,auVar130);
            auVar295 = vpackssdw_avx(auVar36,auVar295);
            auVar263._0_8_ = auVar56._16_8_ ^ 0x8000000000000000;
            auVar263._8_4_ = auVar56._24_4_;
            auVar263._12_4_ = auVar56._28_4_ ^ 0x80000000;
            auVar36 = vpcmpgtq_avx(auVar263,auVar141);
            auVar248._0_8_ = auVar56._0_8_ ^ 0x8000000000000000;
            auVar248._8_4_ = auVar56._8_4_;
            auVar248._12_4_ = auVar56._12_4_ ^ 0x80000000;
            auVar126 = vpcmpgtq_avx(auVar248,auVar204);
            auVar36 = vpackssdw_avx(auVar126,auVar36);
            auVar295 = vpackssdw_avx(auVar36 ^ auVar110,auVar295 ^ auVar110);
            auVar36 = vpmovsxwd_avx(auVar295);
            auVar295 = vpunpckhwd_avx(auVar295,auVar295);
            auVar241._16_16_ = auVar295;
            auVar241._0_16_ = auVar36;
            auVar56 = vmaskmovps_avx(auVar241,*(undefined1 (*) [32])(*pauVar21 + uVar25 * 4));
            auVar4._4_4_ = auVar56._4_4_ * auVar56._4_4_;
            auVar4._0_4_ = auVar56._0_4_ * auVar56._0_4_;
            auVar4._8_4_ = auVar56._8_4_ * auVar56._8_4_;
            auVar4._12_4_ = auVar56._12_4_ * auVar56._12_4_;
            auVar4._16_4_ = auVar56._16_4_ * auVar56._16_4_;
            auVar4._20_4_ = auVar56._20_4_ * auVar56._20_4_;
            auVar4._24_4_ = auVar56._24_4_ * auVar56._24_4_;
            auVar4._28_4_ = auVar56._28_4_;
            auVar56 = vmaskmovps_avx(auVar241,auVar4);
            *(undefined1 (*) [32])(*pauVar21 + uVar25 * 4) = auVar56;
            uVar25 = uVar25 + 8;
          } while ((uVar16 + 8 & 0x1fffffff8) != uVar25);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != iVar23);
    }
    break;
  case 5:
    iVar23 = bottom_top_blob->c;
    if (0 < (long)iVar23) {
      uVar15 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar22 = 0;
      auVar157._8_4_ = 0x7fffffff;
      auVar157._0_8_ = 0x7fffffff7fffffff;
      auVar157._12_4_ = 0x7fffffff;
      auVar157._16_4_ = 0x7fffffff;
      auVar157._20_4_ = 0x7fffffff;
      auVar157._24_4_ = 0x7fffffff;
      auVar157._28_4_ = 0x7fffffff;
      auVar171._8_4_ = 0x800000;
      auVar171._0_8_ = 0x80000000800000;
      auVar171._12_4_ = 0x800000;
      auVar171._16_4_ = 0x800000;
      auVar171._20_4_ = 0x800000;
      auVar171._24_4_ = 0x800000;
      auVar171._28_4_ = 0x800000;
      auVar296._8_8_ = 0x8000000000000000;
      auVar296._0_8_ = 0x8000000000000000;
      auVar110 = vpcmpeqd_avx(in_ZMM11._0_16_,in_ZMM11._0_16_);
      do {
        pauVar21 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar22 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar15 < 8) {
          uVar18 = 0;
        }
        else {
          iVar24 = 7;
          do {
            auVar56 = *pauVar21;
            auVar156 = vrsqrtps_avx(auVar56);
            fVar26 = auVar56._0_4_ * auVar156._0_4_;
            fVar101 = auVar56._4_4_ * auVar156._4_4_;
            fVar102 = auVar56._8_4_ * auVar156._8_4_;
            fVar104 = auVar56._12_4_ * auVar156._12_4_;
            fVar105 = auVar56._16_4_ * auVar156._16_4_;
            fVar106 = auVar56._20_4_ * auVar156._20_4_;
            fVar107 = auVar56._24_4_ * auVar156._24_4_;
            auVar8._4_4_ = fVar101 * -0.5 * (fVar101 * auVar156._4_4_ + -3.0);
            auVar8._0_4_ = fVar26 * -0.5 * (fVar26 * auVar156._0_4_ + -3.0);
            auVar8._8_4_ = fVar102 * -0.5 * (fVar102 * auVar156._8_4_ + -3.0);
            auVar8._12_4_ = fVar104 * -0.5 * (fVar104 * auVar156._12_4_ + -3.0);
            auVar8._16_4_ = fVar105 * -0.5 * (fVar105 * auVar156._16_4_ + -3.0);
            auVar8._20_4_ = fVar106 * -0.5 * (fVar106 * auVar156._20_4_ + -3.0);
            auVar8._24_4_ = fVar107 * -0.5 * (fVar107 * auVar156._24_4_ + -3.0);
            auVar8._28_4_ = auVar156._28_4_ + -3.0;
            auVar56 = vandps_avx(auVar56,auVar157);
            auVar56 = vcmpps_avx(auVar171,auVar56,2);
            auVar56 = vandps_avx(auVar56,auVar8);
            *pauVar21 = auVar56;
            pauVar21 = pauVar21 + 1;
            iVar24 = iVar24 + 8;
            uVar18 = uVar15 & 0xfffffff8;
          } while (iVar24 < (int)uVar15);
        }
        auVar316._8_4_ = 0x800000;
        auVar316._0_8_ = 0x80000000800000;
        auVar314._8_4_ = 0x7fffffff;
        auVar314._0_8_ = 0x7fffffff7fffffff;
        auVar316._12_4_ = 0x800000;
        auVar314._12_4_ = 0x7fffffff;
        uVar17 = uVar18 | 3;
        while ((int)uVar17 < (int)uVar15) {
          auVar141 = *(undefined1 (*) [16])*pauVar21;
          auVar130 = vrsqrtps_avx(auVar141);
          fVar26 = auVar141._0_4_ * auVar130._0_4_;
          fVar101 = auVar141._4_4_ * auVar130._4_4_;
          fVar102 = auVar141._8_4_ * auVar130._8_4_;
          fVar104 = auVar141._12_4_ * auVar130._12_4_;
          in_ZMM6 = ZEXT1664(CONCAT412(fVar104,CONCAT48(fVar102,CONCAT44(fVar101,fVar26))));
          auVar206._0_4_ = fVar26 * -0.5 * (fVar26 * auVar130._0_4_ + -3.0);
          auVar206._4_4_ = fVar101 * -0.5 * (fVar101 * auVar130._4_4_ + -3.0);
          auVar206._8_4_ = fVar102 * -0.5 * (fVar102 * auVar130._8_4_ + -3.0);
          auVar206._12_4_ = fVar104 * -0.5 * (fVar104 * auVar130._12_4_ + -3.0);
          auVar141 = vandps_avx(auVar314,auVar141);
          auVar141 = vcmpps_avx(auVar316,auVar141,2);
          auVar141 = vandps_avx(auVar141,auVar206);
          *(undefined1 (*) [16])*pauVar21 = auVar141;
          pauVar21 = (undefined1 (*) [32])(*pauVar21 + 0x10);
          uVar17 = uVar18 + 7;
          uVar18 = uVar18 + 4;
        }
        if ((int)uVar18 < (int)uVar15) {
          uVar16 = CONCAT44(0,~uVar18 + uVar15);
          auVar311._8_8_ = 0;
          auVar311._0_8_ = uVar16;
          auVar204 = vpshufd_avx(auVar311,0x44);
          auVar141 = vorps_avx(auVar204,auVar296);
          auVar130 = vorps_avx(auVar204,auVar296);
          auVar204 = vorps_avx(auVar204,auVar296);
          uVar25 = 0;
          do {
            auVar317._8_8_ = 0;
            auVar317._0_8_ = uVar25;
            auVar295 = vpshufd_avx(auVar317,0x44);
            auVar320._16_16_ = auVar295;
            auVar320._0_16_ = auVar295;
            auVar56 = vorps_avx(auVar320,auVar133);
            auVar156 = vorps_avx(auVar320,auVar57);
            auVar207._0_8_ = auVar156._16_8_ ^ 0x8000000000000000;
            auVar207._8_4_ = auVar156._24_4_;
            auVar207._12_4_ = auVar156._28_4_ ^ 0x80000000;
            auVar295 = vpcmpgtq_avx(auVar207,auVar141);
            auVar318._8_4_ = auVar156._8_4_;
            auVar318._0_8_ = auVar156._0_8_ ^ 0x8000000000000000;
            auVar318._12_4_ = auVar156._12_4_ ^ 0x80000000;
            auVar36 = vpcmpgtq_avx(auVar318,auVar130);
            auVar295 = vpackssdw_avx(auVar36,auVar295);
            auVar319._8_4_ = auVar56._24_4_;
            auVar319._0_8_ = auVar56._16_8_ ^ 0x8000000000000000;
            auVar319._12_4_ = auVar56._28_4_ ^ 0x80000000;
            auVar36 = vpcmpgtq_avx(auVar319,auVar141);
            auVar190._0_8_ = auVar56._0_8_ ^ 0x8000000000000000;
            auVar190._8_4_ = auVar56._8_4_;
            auVar190._12_4_ = auVar56._12_4_ ^ 0x80000000;
            auVar126 = vpcmpgtq_avx(auVar190,auVar204);
            auVar36 = vpackssdw_avx(auVar126,auVar36);
            auVar295 = vpackssdw_avx(auVar110 ^ auVar36,auVar110 ^ auVar295);
            auVar36 = vpmovsxwd_avx(auVar295);
            auVar295 = vpunpckhwd_avx(auVar295,auVar295);
            auVar194._16_16_ = auVar295;
            auVar194._0_16_ = auVar36;
            auVar156 = vmaskmovps_avx(auVar194,*(undefined1 (*) [32])(*pauVar21 + uVar25 * 4));
            auVar56 = vrsqrtps_avx(auVar156);
            fVar26 = auVar56._0_4_ * auVar156._0_4_;
            fVar101 = auVar56._4_4_ * auVar156._4_4_;
            fVar102 = auVar56._8_4_ * auVar156._8_4_;
            fVar104 = auVar56._12_4_ * auVar156._12_4_;
            fVar105 = auVar56._16_4_ * auVar156._16_4_;
            fVar106 = auVar56._20_4_ * auVar156._20_4_;
            fVar107 = auVar56._24_4_ * auVar156._24_4_;
            auVar9._4_4_ = fVar101 * -0.5 * (auVar56._4_4_ * fVar101 + -3.0);
            auVar9._0_4_ = fVar26 * -0.5 * (auVar56._0_4_ * fVar26 + -3.0);
            auVar9._8_4_ = fVar102 * -0.5 * (auVar56._8_4_ * fVar102 + -3.0);
            auVar9._12_4_ = fVar104 * -0.5 * (auVar56._12_4_ * fVar104 + -3.0);
            auVar9._16_4_ = fVar105 * -0.5 * (auVar56._16_4_ * fVar105 + -3.0);
            auVar9._20_4_ = fVar106 * -0.5 * (auVar56._20_4_ * fVar106 + -3.0);
            auVar9._24_4_ = fVar107 * -0.5 * (auVar56._24_4_ * fVar107 + -3.0);
            auVar9._28_4_ = in_ZMM6._28_4_ + -3.0;
            in_ZMM6 = ZEXT3264(auVar9);
            auVar56 = vandps_avx(auVar156,auVar157);
            auVar56 = vcmpps_avx(auVar171,auVar56,2);
            auVar56 = vandps_avx(auVar56,auVar9);
            auVar56 = vmaskmovps_avx(auVar194,auVar56);
            *(undefined1 (*) [32])(*pauVar21 + uVar25 * 4) = auVar56;
            uVar25 = uVar25 + 8;
          } while ((uVar16 + 8 & 0x1fffffff8) != uVar25);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != iVar23);
    }
    break;
  case 6:
    iVar23 = bottom_top_blob->c;
    if (0 < (long)iVar23) {
      uVar15 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar22 = 0;
      auVar154._8_8_ = 0x8000000000000000;
      auVar154._0_8_ = 0x8000000000000000;
      auVar110 = vpcmpeqd_avx(auVar110,auVar110);
      do {
        pauVar21 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar22 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar15 < 8) {
          uVar18 = 0;
        }
        else {
          iVar24 = 7;
          do {
            auVar56 = vrsqrtps_avx(*pauVar21);
            *pauVar21 = auVar56;
            pauVar21 = pauVar21 + 1;
            iVar24 = iVar24 + 8;
            uVar18 = uVar15 & 0xfffffff8;
          } while (iVar24 < (int)uVar15);
        }
        uVar17 = uVar18 | 3;
        while ((int)uVar17 < (int)uVar15) {
          auVar141 = vrsqrtps_avx(*(undefined1 (*) [16])*pauVar21);
          *(undefined1 (*) [16])*pauVar21 = auVar141;
          pauVar21 = (undefined1 (*) [32])(*pauVar21 + 0x10);
          uVar17 = uVar18 + 7;
          uVar18 = uVar18 + 4;
        }
        if ((int)uVar18 < (int)uVar15) {
          uVar16 = CONCAT44(0,~uVar18 + uVar15);
          auVar227._8_8_ = 0;
          auVar227._0_8_ = uVar16;
          auVar204 = vpshufd_avx(auVar227,0x44);
          auVar141 = vorps_avx(auVar204,auVar154);
          auVar130 = vorps_avx(auVar204,auVar154);
          auVar204 = vorps_avx(auVar204,auVar154);
          uVar25 = 0;
          do {
            auVar274._8_8_ = 0;
            auVar274._0_8_ = uVar25;
            auVar295 = vpshufd_avx(auVar274,0x44);
            auVar287._16_16_ = auVar295;
            auVar287._0_16_ = auVar295;
            auVar56 = vorps_avx(auVar287,auVar133);
            auVar156 = vorps_avx(auVar287,auVar57);
            auVar309._0_8_ = auVar156._16_8_ ^ 0x8000000000000000;
            auVar309._8_4_ = auVar156._24_4_;
            auVar309._12_4_ = auVar156._28_4_ ^ 0x80000000;
            auVar295 = vpcmpgtq_avx(auVar309,auVar141);
            auVar275._0_8_ = auVar156._0_8_ ^ 0x8000000000000000;
            auVar275._8_4_ = auVar156._8_4_;
            auVar275._12_4_ = auVar156._12_4_ ^ 0x80000000;
            auVar36 = vpcmpgtq_avx(auVar275,auVar130);
            auVar295 = vpackssdw_avx(auVar36,auVar295);
            auVar310._0_8_ = auVar56._16_8_ ^ 0x8000000000000000;
            auVar310._8_4_ = auVar56._24_4_;
            auVar310._12_4_ = auVar56._28_4_ ^ 0x80000000;
            auVar36 = vpcmpgtq_avx(auVar310,auVar141);
            auVar298._0_8_ = auVar56._0_8_ ^ 0x8000000000000000;
            auVar298._8_4_ = auVar56._8_4_;
            auVar298._12_4_ = auVar56._12_4_ ^ 0x80000000;
            auVar126 = vpcmpgtq_avx(auVar298,auVar204);
            auVar36 = vpackssdw_avx(auVar126,auVar36);
            auVar295 = vpackssdw_avx(auVar36 ^ auVar110,auVar295 ^ auVar110);
            auVar36 = vpmovsxwd_avx(auVar295);
            auVar295 = vpunpckhwd_avx(auVar295,auVar295);
            auVar288._16_16_ = auVar295;
            auVar288._0_16_ = auVar36;
            auVar156 = vmaskmovps_avx(auVar288,*(undefined1 (*) [32])(*pauVar21 + uVar25 * 4));
            auVar56 = vrsqrtps_avx(auVar156);
            fVar26 = auVar56._0_4_;
            fVar101 = auVar56._4_4_;
            fVar102 = auVar56._8_4_;
            fVar104 = auVar56._12_4_;
            fVar105 = auVar56._16_4_;
            fVar106 = auVar56._20_4_;
            fVar107 = auVar56._24_4_;
            auVar12._4_4_ = fVar101 * -0.5 * (auVar156._4_4_ * fVar101 * fVar101 + -3.0);
            auVar12._0_4_ = fVar26 * -0.5 * (auVar156._0_4_ * fVar26 * fVar26 + -3.0);
            auVar12._8_4_ = fVar102 * -0.5 * (auVar156._8_4_ * fVar102 * fVar102 + -3.0);
            auVar12._12_4_ = fVar104 * -0.5 * (auVar156._12_4_ * fVar104 * fVar104 + -3.0);
            auVar12._16_4_ = fVar105 * -0.5 * (auVar156._16_4_ * fVar105 * fVar105 + -3.0);
            auVar12._20_4_ = fVar106 * -0.5 * (auVar156._20_4_ * fVar106 * fVar106 + -3.0);
            auVar12._24_4_ = fVar107 * -0.5 * (auVar156._24_4_ * fVar107 * fVar107 + -3.0);
            auVar12._28_4_ = auVar156._28_4_ + -3.0;
            auVar56 = vmaskmovps_avx(auVar288,auVar12);
            *(undefined1 (*) [32])(*pauVar21 + uVar25 * 4) = auVar56;
            uVar25 = uVar25 + 8;
          } while ((uVar16 + 8 & 0x1fffffff8) != uVar25);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != iVar23);
    }
    break;
  case 7:
    local_138 = (long)bottom_top_blob->c;
    if (0 < local_138) {
      iVar23 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      local_130 = CONCAT44(local_130._4_4_,iVar23) & 0xfffffffffffffff8;
      lVar22 = 0;
      local_f0._8_8_ = 0x8000000000000000;
      local_f0._0_8_ = 0x8000000000000000;
      do {
        auVar257._8_4_ = 0x3f800000;
        auVar257._0_8_ = 0x3f8000003f800000;
        auVar212._8_4_ = 0xc2b0c0a5;
        auVar212._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar193._8_4_ = 0x42b0c0a5;
        auVar193._0_8_ = 0x42b0c0a542b0c0a5;
        auVar257._12_4_ = 0x3f800000;
        auVar212._12_4_ = 0xc2b0c0a5;
        auVar193._12_4_ = 0x42b0c0a5;
        auVar257._16_4_ = 0x3f800000;
        auVar212._16_4_ = 0xc2b0c0a5;
        auVar193._16_4_ = 0x42b0c0a5;
        auVar257._20_4_ = 0x3f800000;
        auVar212._20_4_ = 0xc2b0c0a5;
        auVar193._20_4_ = 0x42b0c0a5;
        auVar315._8_4_ = 0x3f800000;
        auVar315._0_8_ = 0x3f8000003f800000;
        auVar257._24_4_ = 0x3f800000;
        auVar212._24_4_ = 0xc2b0c0a5;
        auVar193._24_4_ = 0x42b0c0a5;
        auVar315._12_4_ = 0x3f800000;
        auVar257._28_4_ = 0x3f800000;
        auVar212._28_4_ = 0xc2b0c0a5;
        auVar193._28_4_ = 0x42b0c0a5;
        pauVar21 = (undefined1 (*) [32])
                   (local_128->cstep * lVar22 * local_128->elemsize + (long)local_128->data);
        if (iVar23 < 8) {
          uVar15 = 0;
        }
        else {
          iVar24 = 7;
          do {
            auVar133 = vminps_avx(auVar193,*pauVar21);
            auVar57 = vmaxps_avx(auVar133,auVar212);
            auVar138._0_4_ = auVar57._0_4_ * 1.442695 + 0.5;
            auVar138._4_4_ = auVar57._4_4_ * 1.442695 + 0.5;
            auVar138._8_4_ = auVar57._8_4_ * 1.442695 + 0.5;
            auVar138._12_4_ = auVar57._12_4_ * 1.442695 + 0.5;
            auVar138._16_4_ = auVar57._16_4_ * 1.442695 + 0.5;
            auVar138._20_4_ = auVar57._20_4_ * 1.442695 + 0.5;
            auVar138._24_4_ = auVar57._24_4_ * 1.442695 + 0.5;
            auVar138._28_4_ = in_ZMM1._28_4_ + 0.5;
            auVar56 = vroundps_avx(auVar138,1);
            auVar133 = vcmpps_avx(auVar138,auVar56,1);
            auVar133 = vandps_avx(auVar257,auVar133);
            auVar133 = vsubps_avx(auVar56,auVar133);
            fVar26 = auVar57._0_4_ + auVar133._0_4_ * -0.6931472;
            fVar101 = auVar57._4_4_ + auVar133._4_4_ * -0.6931472;
            fVar102 = auVar57._8_4_ + auVar133._8_4_ * -0.6931472;
            fVar104 = auVar57._12_4_ + auVar133._12_4_ * -0.6931472;
            fVar105 = auVar57._16_4_ + auVar133._16_4_ * -0.6931472;
            fVar106 = auVar57._20_4_ + auVar133._20_4_ * -0.6931472;
            fVar107 = auVar57._24_4_ + auVar133._24_4_ * -0.6931472;
            auVar122._0_4_ = (int)auVar133._0_4_;
            auVar122._4_4_ = (int)auVar133._4_4_;
            auVar122._8_4_ = (int)auVar133._8_4_;
            auVar122._12_4_ = (int)auVar133._12_4_;
            auVar139._16_4_ = (int)auVar133._16_4_;
            auVar139._0_16_ = auVar122;
            auVar139._20_4_ = (int)auVar133._20_4_;
            auVar139._24_4_ = (int)auVar133._24_4_;
            auVar139._28_4_ = (int)auVar133._28_4_;
            auVar141 = vpslld_avx(auVar122,0x17);
            auVar110 = vpslld_avx(auVar139._16_16_,0x17);
            auVar110 = vpaddd_avx(auVar315,auVar110);
            auVar141 = vpaddd_avx(auVar315,auVar141);
            in_ZMM1 = ZEXT3264(CONCAT1616(auVar110,auVar141));
            *(float *)*pauVar21 =
                 (fVar26 + 1.0 +
                 fVar26 * fVar26 *
                 (((((fVar26 * 0.00019875691 + 0.0013981999) * fVar26 + 0.008333452) * fVar26 +
                   0.041665796) * fVar26 + 0.16666666) * fVar26 + 0.5)) * auVar141._0_4_;
            *(float *)(*pauVar21 + 4) =
                 (fVar101 + 1.0 +
                 fVar101 * fVar101 *
                 (((((fVar101 * 0.00019875691 + 0.0013981999) * fVar101 + 0.008333452) * fVar101 +
                   0.041665796) * fVar101 + 0.16666666) * fVar101 + 0.5)) * auVar141._4_4_;
            *(float *)(*pauVar21 + 8) =
                 (fVar102 + 1.0 +
                 fVar102 * fVar102 *
                 (((((fVar102 * 0.00019875691 + 0.0013981999) * fVar102 + 0.008333452) * fVar102 +
                   0.041665796) * fVar102 + 0.16666666) * fVar102 + 0.5)) * auVar141._8_4_;
            *(float *)(*pauVar21 + 0xc) =
                 (fVar104 + 1.0 +
                 fVar104 * fVar104 *
                 (((((fVar104 * 0.00019875691 + 0.0013981999) * fVar104 + 0.008333452) * fVar104 +
                   0.041665796) * fVar104 + 0.16666666) * fVar104 + 0.5)) * auVar141._12_4_;
            *(float *)(*pauVar21 + 0x10) =
                 (fVar105 + 1.0 +
                 fVar105 * fVar105 *
                 (((((fVar105 * 0.00019875691 + 0.0013981999) * fVar105 + 0.008333452) * fVar105 +
                   0.041665796) * fVar105 + 0.16666666) * fVar105 + 0.5)) * auVar110._0_4_;
            *(float *)(*pauVar21 + 0x14) =
                 (fVar106 + 1.0 +
                 fVar106 * fVar106 *
                 (((((fVar106 * 0.00019875691 + 0.0013981999) * fVar106 + 0.008333452) * fVar106 +
                   0.041665796) * fVar106 + 0.16666666) * fVar106 + 0.5)) * auVar110._4_4_;
            *(float *)(*pauVar21 + 0x18) =
                 (fVar107 + 1.0 +
                 fVar107 * fVar107 *
                 (((((fVar107 * 0.00019875691 + 0.0013981999) * fVar107 + 0.008333452) * fVar107 +
                   0.041665796) * fVar107 + 0.16666666) * fVar107 + 0.5)) * auVar110._8_4_;
            *(float *)(*pauVar21 + 0x1c) = auVar57._28_4_ + auVar56._28_4_ + 1.0 + auVar56._28_4_;
            pauVar21 = pauVar21 + 1;
            iVar24 = iVar24 + 8;
          } while (iVar24 < iVar23);
          uVar15 = (uint)local_130;
        }
        auVar188._8_4_ = 0x42b0c0a5;
        auVar188._0_8_ = 0x42b0c0a542b0c0a5;
        auVar188._12_4_ = 0x42b0c0a5;
        auVar205._8_4_ = 0xc2b0c0a5;
        auVar205._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar205._12_4_ = 0xc2b0c0a5;
        uVar18 = uVar15 | 3;
        while ((int)uVar18 < iVar23) {
          auVar110 = vminps_avx(auVar188,*(undefined1 (*) [16])*pauVar21);
          auVar130 = vmaxps_avx(auVar110,auVar205);
          auVar123._0_4_ = auVar130._0_4_ * 1.442695 + 0.5;
          auVar123._4_4_ = auVar130._4_4_ * 1.442695 + 0.5;
          auVar123._8_4_ = auVar130._8_4_ * 1.442695 + 0.5;
          auVar123._12_4_ = auVar130._12_4_ * 1.442695 + 0.5;
          auVar150._0_4_ = (int)auVar123._0_4_;
          auVar150._4_4_ = (int)auVar123._4_4_;
          auVar150._8_4_ = (int)auVar123._8_4_;
          auVar150._12_4_ = (int)auVar123._12_4_;
          auVar141 = vcvtdq2ps_avx(auVar150);
          auVar110 = vcmpps_avx(auVar123,auVar141,1);
          auVar110 = vandps_avx(auVar315,auVar110);
          auVar110 = vsubps_avx(auVar141,auVar110);
          fVar26 = auVar130._0_4_ + auVar110._0_4_ * -0.6931472;
          fVar101 = auVar130._4_4_ + auVar110._4_4_ * -0.6931472;
          fVar102 = auVar130._8_4_ + auVar110._8_4_ * -0.6931472;
          fVar104 = auVar130._12_4_ + auVar110._12_4_ * -0.6931472;
          auVar124._0_4_ = (int)auVar110._0_4_;
          auVar124._4_4_ = (int)auVar110._4_4_;
          auVar124._8_4_ = (int)auVar110._8_4_;
          auVar124._12_4_ = (int)auVar110._12_4_;
          auVar110 = vpslld_avx(auVar124,0x17);
          auVar110 = vpaddd_avx(auVar315,auVar110);
          in_ZMM1 = ZEXT1664(auVar110);
          *(float *)*pauVar21 =
               (fVar26 + 1.0 +
               fVar26 * fVar26 *
               (((((fVar26 * 0.00019875691 + 0.0013981999) * fVar26 + 0.008333452) * fVar26 +
                 0.041665796) * fVar26 + 0.16666666) * fVar26 + 0.5)) * auVar110._0_4_;
          *(float *)(*pauVar21 + 4) =
               (fVar101 + 1.0 +
               fVar101 * fVar101 *
               (((((fVar101 * 0.00019875691 + 0.0013981999) * fVar101 + 0.008333452) * fVar101 +
                 0.041665796) * fVar101 + 0.16666666) * fVar101 + 0.5)) * auVar110._4_4_;
          *(float *)(*pauVar21 + 8) =
               (fVar102 + 1.0 +
               fVar102 * fVar102 *
               (((((fVar102 * 0.00019875691 + 0.0013981999) * fVar102 + 0.008333452) * fVar102 +
                 0.041665796) * fVar102 + 0.16666666) * fVar102 + 0.5)) * auVar110._8_4_;
          *(float *)(*pauVar21 + 0xc) =
               (fVar104 + 1.0 +
               fVar104 * fVar104 *
               (((((fVar104 * 0.00019875691 + 0.0013981999) * fVar104 + 0.008333452) * fVar104 +
                 0.041665796) * fVar104 + 0.16666666) * fVar104 + 0.5)) * auVar110._12_4_;
          pauVar21 = (undefined1 (*) [32])(*pauVar21 + 0x10);
          uVar18 = uVar15 + 7;
          uVar15 = uVar15 + 4;
        }
        auVar110 = vpcmpeqd_avx(auVar188,auVar188);
        if ((int)uVar15 < iVar23) {
          uVar16 = CONCAT44(0,~uVar15 + iVar23);
          auVar34._8_8_ = 0;
          auVar34._0_8_ = uVar16;
          local_a0._0_16_ = vpshufd_avx(auVar34,0x44);
          local_d0 = vpor_avx(local_f0,local_a0._0_16_);
          local_e0 = vpor_avx(local_f0,local_a0._0_16_);
          uVar25 = 0;
          auVar133 = _DAT_00594ae0;
          local_a0._16_16_ = local_a0._0_16_;
          do {
            auVar35._8_8_ = 0;
            auVar35._0_8_ = uVar25;
            auVar141 = vpshufd_avx(auVar35,0x44);
            auVar54._16_16_ = auVar141;
            auVar54._0_16_ = auVar141;
            auVar57 = vorps_avx(auVar54,_DAT_00594ac0);
            auVar133 = vorps_avx(auVar54,auVar133);
            auVar204 = vpor_avx(local_f0,local_a0._16_16_);
            auVar141 = vpcmpgtq_avx(local_f0 ^ auVar133._16_16_,auVar204);
            auVar130 = vpcmpgtq_avx(local_f0 ^ auVar133._0_16_,local_d0);
            auVar141 = vpackssdw_avx(auVar130,auVar141);
            auVar130 = vpcmpgtq_avx(local_f0 ^ auVar57._16_16_,auVar204);
            auVar125._0_4_ = local_f0._0_4_ ^ auVar57._0_4_;
            auVar125._4_4_ = local_f0._4_4_ ^ auVar57._4_4_;
            auVar125._8_4_ = local_f0._8_4_ ^ auVar57._8_4_;
            auVar125._12_4_ = local_f0._12_4_ ^ auVar57._12_4_;
            auVar204 = vpcmpgtq_avx(auVar125,local_e0);
            auVar130 = vpackssdw_avx(auVar204,auVar130);
            auVar141 = vpackssdw_avx(auVar130 ^ auVar110,auVar141 ^ auVar110);
            auVar130 = vpmovsxwd_avx(auVar141);
            auVar141 = vpunpckhwd_avx(auVar141,auVar141);
            local_80._16_16_ = auVar141;
            local_80._0_16_ = auVar130;
            local_120 = vmaskmovps_avx(local_80,*(undefined1 (*) [32])(*pauVar21 + uVar25 * 4));
            local_150 = local_120._16_16_;
            local_160._0_4_ = expf(local_120._16_4_);
            local_160._4_4_ = extraout_XMM0_Db_03;
            local_160._8_4_ = extraout_XMM0_Dc_03;
            local_160._12_4_ = extraout_XMM0_Dd_03;
            auVar141 = vmovshdup_avx(local_150);
            auVar77._0_4_ = expf(auVar141._0_4_);
            auVar77._4_60_ = extraout_var_11;
            local_160 = vinsertps_avx(local_160,auVar77._0_16_,0x10);
            auVar141 = vpermilpd_avx(local_150,1);
            auVar78._0_4_ = expf(auVar141._0_4_);
            auVar78._4_60_ = extraout_var_12;
            local_160 = vinsertps_avx(local_160,auVar78._0_16_,0x20);
            auVar141 = vpermilps_avx(local_150,0xff);
            auVar79._0_4_ = expf(auVar141._0_4_);
            auVar79._4_60_ = extraout_var_13;
            local_150 = vinsertps_avx(local_160,auVar79._0_16_,0x30);
            local_160._0_4_ = expf((float)local_120._0_4_);
            local_160._4_4_ = extraout_XMM0_Db_04;
            local_160._8_4_ = extraout_XMM0_Dc_04;
            local_160._12_4_ = extraout_XMM0_Dd_04;
            auVar141 = vmovshdup_avx(local_120._0_16_);
            auVar80._0_4_ = expf(auVar141._0_4_);
            auVar80._4_60_ = extraout_var_14;
            local_160 = vinsertps_avx(local_160,auVar80._0_16_,0x10);
            auVar141 = vpermilpd_avx(local_120._0_16_,1);
            auVar81._0_4_ = expf(auVar141._0_4_);
            auVar81._4_60_ = extraout_var_15;
            local_160 = vinsertps_avx(local_160,auVar81._0_16_,0x20);
            auVar141 = vpermilps_avx(local_120._0_16_,0xff);
            auVar82._0_4_ = expf(auVar141._0_4_);
            auVar133 = _DAT_00594ae0;
            auVar82._4_60_ = extraout_var_16;
            auVar110 = vpcmpeqd_avx(auVar110,auVar110);
            auVar141 = vinsertps_avx(local_160,auVar82._0_16_,0x30);
            auVar55._16_16_ = local_150;
            auVar55._0_16_ = auVar141;
            in_ZMM1 = ZEXT3264(local_80);
            auVar57 = vmaskmovps_avx(local_80,auVar55);
            *(undefined1 (*) [32])(*pauVar21 + uVar25 * 4) = auVar57;
            uVar25 = uVar25 + 8;
          } while ((uVar16 + 8 & 0x1fffffff8) != uVar25);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != local_138);
    }
    break;
  case 8:
    local_130 = (ulong)bottom_top_blob->c;
    if (0 < (long)local_130) {
      iVar23 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      local_138 = 0;
      local_f0._8_8_ = 0x8000000000000000;
      local_f0._0_8_ = 0x8000000000000000;
      do {
        pfVar20 = (float *)(local_128->cstep * local_138 * local_128->elemsize +
                           (long)local_128->data);
        if (iVar23 < 8) {
          uVar15 = 0;
        }
        else {
          uVar18 = 0;
          do {
            local_c0 = *(undefined1 (*) [32])pfVar20;
            UnaryOp_x86_avx_functor::unary_op_log::func_pack8
                      ((unary_op_log *)&local_161,(__m256 *)local_c0);
            *(undefined1 (*) [32])pfVar20 = local_c0;
            pfVar20 = pfVar20 + 8;
            uVar15 = uVar18 + 8;
            iVar24 = uVar18 + 0xf;
            uVar18 = uVar15;
          } while (iVar24 < iVar23);
        }
        auVar228._8_4_ = 0x3f000000;
        auVar228._0_8_ = 0x3f0000003f000000;
        auVar228._12_4_ = 0x3f000000;
        auVar238._8_4_ = 0xffffff82;
        auVar238._0_8_ = 0xffffff82ffffff82;
        auVar238._12_4_ = 0xffffff82;
        auVar254._8_4_ = 0x3f3504f3;
        auVar254._0_8_ = 0x3f3504f33f3504f3;
        auVar254._12_4_ = 0x3f3504f3;
        auVar299._8_4_ = 0x3f800000;
        auVar299._0_8_ = 0x3f8000003f800000;
        auVar299._12_4_ = 0x3f800000;
        auVar210._8_4_ = 0x3e4cceac;
        auVar210._0_8_ = 0x3e4cceac3e4cceac;
        auVar210._12_4_ = 0x3e4cceac;
        uVar18 = uVar15 | 3;
        while ((int)uVar18 < iVar23) {
          auVar43._8_4_ = 0x800000;
          auVar43._0_8_ = 0x80000000800000;
          auVar43._12_4_ = 0x800000;
          auVar110 = vmaxps_avx(auVar43,*(undefined1 (*) [16])pfVar20);
          auVar141 = vpsrld_avx(auVar110,0x17);
          auVar141 = vpaddd_avx(auVar141,auVar238);
          auVar155._8_4_ = 0x807fffff;
          auVar155._0_8_ = 0x807fffff807fffff;
          auVar155._12_4_ = 0x807fffff;
          auVar110 = vandps_avx(auVar110,auVar155);
          auVar204 = vorps_avx(auVar110,auVar228);
          auVar130 = vcvtdq2ps_avx(auVar141);
          auVar141 = vcmpps_avx(auVar204,auVar254,1);
          auVar110 = vandps_avx(auVar141,auVar204);
          fVar26 = auVar204._0_4_ + -1.0 + auVar110._0_4_;
          fVar101 = auVar204._4_4_ + -1.0 + auVar110._4_4_;
          fVar102 = auVar204._8_4_ + -1.0 + auVar110._8_4_;
          fVar104 = auVar204._12_4_ + -1.0 + auVar110._12_4_;
          auVar110 = vandps_avx(auVar299,auVar141);
          auVar110 = vsubps_avx(auVar130,auVar110);
          auVar44._0_4_ =
               auVar110._0_4_ * 0.6931472 + fVar26 +
               fVar26 * fVar26 *
               (((((((((fVar26 * 0.070376836 + -0.1151461) * fVar26 + 0.116769984) * fVar26 +
                     -0.12420141) * fVar26 + 0.14249323) * fVar26 + -0.16668057) * fVar26 +
                  0.20000714) * fVar26 + -0.24999994) * fVar26 + 0.3333333) * fVar26 + -0.5);
          auVar44._4_4_ =
               auVar110._4_4_ * 0.6931472 + fVar101 +
               fVar101 * fVar101 *
               (((((((((fVar101 * 0.070376836 + -0.1151461) * fVar101 + 0.116769984) * fVar101 +
                     -0.12420141) * fVar101 + 0.14249323) * fVar101 + -0.16668057) * fVar101 +
                  0.20000714) * fVar101 + -0.24999994) * fVar101 + 0.3333333) * fVar101 + -0.5);
          auVar44._8_4_ =
               auVar110._8_4_ * 0.6931472 + fVar102 +
               fVar102 * fVar102 *
               (((((((((fVar102 * 0.070376836 + -0.1151461) * fVar102 + 0.116769984) * fVar102 +
                     -0.12420141) * fVar102 + 0.14249323) * fVar102 + -0.16668057) * fVar102 +
                  0.20000714) * fVar102 + -0.24999994) * fVar102 + 0.3333333) * fVar102 + -0.5);
          auVar44._12_4_ =
               auVar110._12_4_ * 0.6931472 + fVar104 +
               fVar104 * fVar104 *
               (((((((((fVar104 * 0.070376836 + -0.1151461) * fVar104 + 0.116769984) * fVar104 +
                     -0.12420141) * fVar104 + 0.14249323) * fVar104 + -0.16668057) * fVar104 +
                  0.20000714) * fVar104 + -0.24999994) * fVar104 + 0.3333333) * fVar104 + -0.5);
          *(undefined1 (*) [16])pfVar20 = auVar44;
          pfVar20 = pfVar20 + 4;
          uVar18 = uVar15 + 7;
          uVar15 = uVar15 + 4;
        }
        auVar110 = vpcmpeqd_avx(auVar210,auVar210);
        if ((int)uVar15 < iVar23) {
          uVar16 = CONCAT44(0,~uVar15 + iVar23);
          auVar45._8_8_ = 0;
          auVar45._0_8_ = uVar16;
          auVar141 = vpshufd_avx(auVar45,0x44);
          local_a0._16_16_ = auVar141;
          local_a0._0_16_ = auVar141;
          local_d0 = vpor_avx(auVar141,local_f0);
          local_e0 = vpor_avx(auVar141,local_f0);
          uVar25 = 0;
          auVar133 = _DAT_00594ae0;
          do {
            auVar46._8_8_ = 0;
            auVar46._0_8_ = uVar25;
            auVar141 = vpshufd_avx(auVar46,0x44);
            auVar62._16_16_ = auVar141;
            auVar62._0_16_ = auVar141;
            auVar57 = vorps_avx(auVar62,_DAT_00594ac0);
            auVar133 = vorps_avx(auVar62,auVar133);
            auVar204 = vpor_avx(local_a0._16_16_,local_f0);
            auVar141 = vpcmpgtq_avx(auVar133._16_16_ ^ local_f0,auVar204);
            auVar130 = vpcmpgtq_avx(auVar133._0_16_ ^ local_f0,local_d0);
            auVar141 = vpackssdw_avx(auVar130,auVar141);
            auVar130 = vpcmpgtq_avx(auVar57._16_16_ ^ local_f0,auVar204);
            auVar132._0_4_ = auVar57._0_4_ ^ local_f0._0_4_;
            auVar132._4_4_ = auVar57._4_4_ ^ local_f0._4_4_;
            auVar132._8_4_ = auVar57._8_4_ ^ local_f0._8_4_;
            auVar132._12_4_ = auVar57._12_4_ ^ local_f0._12_4_;
            auVar204 = vpcmpgtq_avx(auVar132,local_e0);
            auVar130 = vpackssdw_avx(auVar204,auVar130);
            auVar141 = vpackssdw_avx(auVar130 ^ auVar110,auVar141 ^ auVar110);
            auVar130 = vpmovsxwd_avx(auVar141);
            auVar141 = vpunpckhwd_avx(auVar141,auVar141);
            local_80._16_16_ = auVar141;
            local_80._0_16_ = auVar130;
            local_120 = vmaskmovps_avx(local_80,*(undefined1 (*) [32])(pfVar20 + uVar25));
            local_150 = local_120._16_16_;
            local_160._0_4_ = logf(local_120._16_4_);
            local_160._4_4_ = extraout_XMM0_Db_09;
            local_160._8_4_ = extraout_XMM0_Dc_09;
            local_160._12_4_ = extraout_XMM0_Dd_09;
            auVar141 = vmovshdup_avx(local_150);
            auVar95._0_4_ = logf(auVar141._0_4_);
            auVar95._4_60_ = extraout_var_29;
            local_160 = vinsertps_avx(local_160,auVar95._0_16_,0x10);
            auVar141 = vpermilpd_avx(local_150,1);
            auVar96._0_4_ = logf(auVar141._0_4_);
            auVar96._4_60_ = extraout_var_30;
            local_160 = vinsertps_avx(local_160,auVar96._0_16_,0x20);
            auVar141 = vpermilps_avx(local_150,0xff);
            auVar97._0_4_ = logf(auVar141._0_4_);
            auVar97._4_60_ = extraout_var_31;
            local_150 = vinsertps_avx(local_160,auVar97._0_16_,0x30);
            local_160._0_4_ = logf((float)local_120._0_4_);
            local_160._4_4_ = extraout_XMM0_Db_10;
            local_160._8_4_ = extraout_XMM0_Dc_10;
            local_160._12_4_ = extraout_XMM0_Dd_10;
            auVar141 = vmovshdup_avx(local_120._0_16_);
            auVar98._0_4_ = logf(auVar141._0_4_);
            auVar98._4_60_ = extraout_var_32;
            local_160 = vinsertps_avx(local_160,auVar98._0_16_,0x10);
            auVar141 = vpermilpd_avx(local_120._0_16_,1);
            auVar99._0_4_ = logf(auVar141._0_4_);
            auVar99._4_60_ = extraout_var_33;
            local_160 = vinsertps_avx(local_160,auVar99._0_16_,0x20);
            auVar141 = vpermilps_avx(local_120._0_16_,0xff);
            auVar100._0_4_ = logf(auVar141._0_4_);
            auVar133 = _DAT_00594ae0;
            auVar100._4_60_ = extraout_var_34;
            auVar110 = vpcmpeqd_avx(auVar110,auVar110);
            auVar141 = vinsertps_avx(local_160,auVar100._0_16_,0x30);
            auVar63._16_16_ = local_150;
            auVar63._0_16_ = auVar141;
            auVar57 = vmaskmovps_avx(local_80,auVar63);
            *(undefined1 (*) [32])(pfVar20 + uVar25) = auVar57;
            uVar25 = uVar25 + 8;
          } while ((uVar16 + 8 & 0x1fffffff8) != uVar25);
        }
        local_138 = local_138 + 1;
      } while (local_138 != local_130);
    }
    break;
  case 9:
    local_130 = (ulong)bottom_top_blob->c;
    if (0 < (long)local_130) {
      iVar23 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      local_138 = 0;
      local_f0._8_8_ = 0x8000000000000000;
      local_f0._0_8_ = 0x8000000000000000;
      do {
        auVar110 = in_ZMM8._0_16_;
        pfVar20 = (float *)(local_128->cstep * local_138 * local_128->elemsize +
                           (long)local_128->data);
        if (iVar23 < 8) {
          uVar15 = 0;
        }
        else {
          uVar18 = 0;
          do {
            local_c0 = *(undefined1 (*) [32])pfVar20;
            UnaryOp_x86_avx_functor::unary_op_sin::func_pack8
                      ((unary_op_sin *)&local_161,(__m256 *)local_c0);
            auVar110 = in_ZMM8._0_16_;
            *(undefined1 (*) [32])pfVar20 = local_c0;
            pfVar20 = pfVar20 + 8;
            uVar15 = uVar18 + 8;
            iVar24 = uVar18 + 0xf;
            uVar18 = uVar15;
          } while (iVar24 < iVar23);
        }
        uVar18 = uVar15 | 3;
        auVar110 = vpcmpeqd_avx(auVar110,auVar110);
        in_ZMM8 = ZEXT1664(auVar110);
        auVar292._8_4_ = 2;
        auVar292._0_8_ = 0x200000002;
        auVar292._12_4_ = 2;
        while ((int)uVar18 < iVar23) {
          auVar118._8_4_ = 0x7fffffff;
          auVar118._0_8_ = 0x7fffffff7fffffff;
          auVar118._12_4_ = 0x7fffffff;
          auVar141 = vandps_avx(*(undefined1 (*) [16])pfVar20,auVar118);
          auVar146._0_4_ = (int)(auVar141._0_4_ * 1.2732395);
          auVar146._4_4_ = (int)(auVar141._4_4_ * 1.2732395);
          auVar146._8_4_ = (int)(auVar141._8_4_ * 1.2732395);
          auVar146._12_4_ = (int)(auVar141._12_4_ * 1.2732395);
          auVar204 = vpsubd_avx(auVar146,auVar110);
          auVar165._8_4_ = 0xfffffffe;
          auVar165._0_8_ = 0xfffffffefffffffe;
          auVar165._12_4_ = 0xfffffffe;
          auVar130 = vpand_avx(auVar204,auVar165);
          auVar130 = vcvtdq2ps_avx(auVar130);
          fVar26 = auVar141._0_4_ + auVar130._0_4_ * -0.7853982;
          fVar101 = auVar141._4_4_ + auVar130._4_4_ * -0.7853982;
          fVar102 = auVar141._8_4_ + auVar130._8_4_ * -0.7853982;
          fVar104 = auVar141._12_4_ + auVar130._12_4_ * -0.7853982;
          fVar105 = fVar26 * fVar26;
          fVar106 = fVar101 * fVar101;
          fVar107 = fVar102 * fVar102;
          fVar161 = fVar104 * fVar104;
          auVar119._0_4_ =
               fVar105 * fVar26 * ((fVar105 * -0.00019515296 + 0.008332161) * fVar105 + -0.16666655)
               + fVar26;
          auVar119._4_4_ =
               fVar106 * fVar101 *
               ((fVar106 * -0.00019515296 + 0.008332161) * fVar106 + -0.16666655) + fVar101;
          auVar119._8_4_ =
               fVar107 * fVar102 *
               ((fVar107 * -0.00019515296 + 0.008332161) * fVar107 + -0.16666655) + fVar102;
          auVar119._12_4_ =
               fVar161 * fVar104 *
               ((fVar161 * -0.00019515296 + 0.008332161) * fVar161 + -0.16666655) + fVar104;
          auVar141 = vpand_avx(auVar292,auVar204);
          auVar141 = vpcmpeqd_avx(auVar141,_DAT_00592010);
          auVar184._0_4_ =
               (((fVar105 * 2.4433157e-05 + -0.0013887316) * fVar105 + 0.041666646) * fVar105 + -0.5
               ) * fVar105 + 1.0;
          auVar184._4_4_ =
               (((fVar106 * 2.4433157e-05 + -0.0013887316) * fVar106 + 0.041666646) * fVar106 + -0.5
               ) * fVar106 + 1.0;
          auVar184._8_4_ =
               (((fVar107 * 2.4433157e-05 + -0.0013887316) * fVar107 + 0.041666646) * fVar107 + -0.5
               ) * fVar107 + 1.0;
          auVar184._12_4_ =
               (((fVar161 * 2.4433157e-05 + -0.0013887316) * fVar161 + 0.041666646) * fVar161 + -0.5
               ) * fVar161 + 1.0;
          auVar141 = vblendvps_avx(auVar184,auVar119,auVar141);
          auVar130 = vpslld_avx(auVar204,0x1d);
          auVar147._8_4_ = 0x80000000;
          auVar147._0_8_ = 0x8000000080000000;
          auVar147._12_4_ = 0x80000000;
          auVar130 = vpand_avx(auVar130 ^ *(undefined1 (*) [16])pfVar20,auVar147);
          *(undefined1 (*) [16])pfVar20 = auVar130 ^ auVar141;
          pfVar20 = pfVar20 + 4;
          uVar18 = uVar15 + 7;
          uVar15 = uVar15 + 4;
        }
        if ((int)uVar15 < iVar23) {
          uVar16 = CONCAT44(0,~uVar15 + iVar23);
          auVar32._8_8_ = 0;
          auVar32._0_8_ = uVar16;
          auVar110 = vpshufd_avx(auVar32,0x44);
          local_a0._16_16_ = auVar110;
          local_a0._0_16_ = auVar110;
          local_d0 = vpor_avx(auVar110,local_f0);
          local_e0 = vpor_avx(auVar110,local_f0);
          uVar25 = 0;
          auVar133 = _DAT_00594ae0;
          do {
            auVar33._8_8_ = 0;
            auVar33._0_8_ = uVar25;
            auVar110 = vpshufd_avx(auVar33,0x44);
            auVar51._16_16_ = auVar110;
            auVar51._0_16_ = auVar110;
            auVar57 = vorps_avx(auVar51,_DAT_00594ac0);
            auVar133 = vorps_avx(auVar51,auVar133);
            auVar130 = vpor_avx(local_a0._16_16_,local_f0);
            auVar110 = vpcmpgtq_avx(auVar133._16_16_ ^ local_f0,auVar130);
            auVar141 = vpcmpgtq_avx(auVar133._0_16_ ^ local_f0,local_d0);
            auVar110 = vpackssdw_avx(auVar141,auVar110);
            auVar204 = in_ZMM8._0_16_;
            auVar141 = vpcmpgtq_avx(auVar57._16_16_ ^ local_f0,auVar130);
            auVar120._0_4_ = auVar57._0_4_ ^ local_f0._0_4_;
            auVar120._4_4_ = auVar57._4_4_ ^ local_f0._4_4_;
            auVar120._8_4_ = auVar57._8_4_ ^ local_f0._8_4_;
            auVar120._12_4_ = auVar57._12_4_ ^ local_f0._12_4_;
            auVar130 = vpcmpgtq_avx(auVar120,local_e0);
            auVar141 = vpackssdw_avx(auVar130,auVar141);
            auVar110 = vpackssdw_avx(auVar204 ^ auVar141,auVar204 ^ auVar110);
            auVar141 = vpmovsxwd_avx(auVar110);
            auVar110 = vpunpckhwd_avx(auVar110,auVar110);
            local_80._16_16_ = auVar110;
            local_80._0_16_ = auVar141;
            local_120 = vmaskmovps_avx(local_80,*(undefined1 (*) [32])(pfVar20 + uVar25));
            local_150 = local_120._16_16_;
            local_160._0_4_ = sinf(local_120._16_4_);
            local_160._4_4_ = extraout_XMM0_Db_01;
            local_160._8_4_ = extraout_XMM0_Dc_01;
            local_160._12_4_ = extraout_XMM0_Dd_01;
            auVar110 = vmovshdup_avx(local_150);
            auVar71._0_4_ = sinf(auVar110._0_4_);
            auVar71._4_60_ = extraout_var_05;
            local_160 = vinsertps_avx(local_160,auVar71._0_16_,0x10);
            auVar110 = vpermilpd_avx(local_150,1);
            auVar72._0_4_ = sinf(auVar110._0_4_);
            auVar72._4_60_ = extraout_var_06;
            local_160 = vinsertps_avx(local_160,auVar72._0_16_,0x20);
            auVar110 = vpermilps_avx(local_150,0xff);
            auVar73._0_4_ = sinf(auVar110._0_4_);
            auVar73._4_60_ = extraout_var_07;
            local_150 = vinsertps_avx(local_160,auVar73._0_16_,0x30);
            local_160._0_4_ = sinf((float)local_120._0_4_);
            local_160._4_4_ = extraout_XMM0_Db_02;
            local_160._8_4_ = extraout_XMM0_Dc_02;
            local_160._12_4_ = extraout_XMM0_Dd_02;
            auVar110 = vmovshdup_avx(local_120._0_16_);
            auVar74._0_4_ = sinf(auVar110._0_4_);
            auVar74._4_60_ = extraout_var_08;
            local_160 = vinsertps_avx(local_160,auVar74._0_16_,0x10);
            auVar110 = vpermilpd_avx(local_120._0_16_,1);
            auVar75._0_4_ = sinf(auVar110._0_4_);
            auVar75._4_60_ = extraout_var_09;
            local_160 = vinsertps_avx(local_160,auVar75._0_16_,0x20);
            auVar110 = vpermilps_avx(local_120._0_16_,0xff);
            auVar76._0_4_ = sinf(auVar110._0_4_);
            auVar133 = _DAT_00594ae0;
            auVar76._4_60_ = extraout_var_10;
            auVar110 = vpcmpeqd_avx(auVar204,auVar204);
            in_ZMM8 = ZEXT1664(auVar110);
            auVar110 = vinsertps_avx(local_160,auVar76._0_16_,0x30);
            auVar52._16_16_ = local_150;
            auVar52._0_16_ = auVar110;
            auVar57 = vmaskmovps_avx(local_80,auVar52);
            *(undefined1 (*) [32])(pfVar20 + uVar25) = auVar57;
            uVar25 = uVar25 + 8;
          } while ((uVar16 + 8 & 0x1fffffff8) != uVar25);
        }
        local_138 = local_138 + 1;
      } while (local_138 != local_130);
    }
    break;
  case 10:
    local_130 = (ulong)bottom_top_blob->c;
    if (0 < (long)local_130) {
      iVar23 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      local_138 = 0;
      local_f0._8_8_ = 0x8000000000000000;
      local_f0._0_8_ = 0x8000000000000000;
      do {
        auVar110 = in_ZMM7._0_16_;
        pfVar20 = (float *)(local_128->cstep * local_138 * local_128->elemsize +
                           (long)local_128->data);
        if (iVar23 < 8) {
          uVar15 = 0;
        }
        else {
          uVar18 = 0;
          do {
            local_c0 = *(undefined1 (*) [32])pfVar20;
            UnaryOp_x86_avx_functor::unary_op_cos::func_pack8
                      ((unary_op_cos *)&local_161,(__m256 *)local_c0);
            auVar110 = in_ZMM7._0_16_;
            *(undefined1 (*) [32])pfVar20 = local_c0;
            pfVar20 = pfVar20 + 8;
            uVar15 = uVar18 + 8;
            iVar24 = uVar18 + 0xf;
            uVar18 = uVar15;
          } while (iVar24 < iVar23);
        }
        uVar18 = uVar15 | 3;
        auVar110 = vpcmpeqd_avx(auVar110,auVar110);
        in_ZMM7 = ZEXT1664(auVar110);
        auVar253._8_4_ = 0xfffffffe;
        auVar253._0_8_ = 0xfffffffefffffffe;
        auVar253._12_4_ = 0xfffffffe;
        auVar276._8_4_ = 2;
        auVar276._0_8_ = 0x200000002;
        auVar276._12_4_ = 2;
        auVar209._8_4_ = 0x80000000;
        auVar209._0_8_ = 0x8000000080000000;
        auVar209._12_4_ = 0x80000000;
        while ((int)uVar18 < iVar23) {
          auVar39._8_4_ = 0x7fffffff;
          auVar39._0_8_ = 0x7fffffff7fffffff;
          auVar39._12_4_ = 0x7fffffff;
          auVar141 = vandps_avx(auVar39,*(undefined1 (*) [16])pfVar20);
          auVar129._0_4_ = (int)(auVar141._0_4_ * 1.2732395);
          auVar129._4_4_ = (int)(auVar141._4_4_ * 1.2732395);
          auVar129._8_4_ = (int)(auVar141._8_4_ * 1.2732395);
          auVar129._12_4_ = (int)(auVar141._12_4_ * 1.2732395);
          auVar130 = vpsubd_avx(auVar129,auVar110);
          auVar204 = vpand_avx(auVar253,auVar130);
          auVar130 = vcvtdq2ps_avx(auVar204);
          fVar26 = auVar141._0_4_ + auVar130._0_4_ * -0.7853982;
          fVar101 = auVar141._4_4_ + auVar130._4_4_ * -0.7853982;
          fVar102 = auVar141._8_4_ + auVar130._8_4_ * -0.7853982;
          fVar104 = auVar141._12_4_ + auVar130._12_4_ * -0.7853982;
          fVar105 = fVar26 * fVar26;
          fVar106 = fVar101 * fVar101;
          fVar107 = fVar102 * fVar102;
          fVar161 = fVar104 * fVar104;
          auVar130 = vpaddd_avx(auVar253,auVar204);
          auVar40._0_4_ =
               fVar105 * fVar26 * ((fVar105 * -0.00019515296 + 0.008332161) * fVar105 + -0.16666655)
               + fVar26;
          auVar40._4_4_ =
               fVar106 * fVar101 *
               ((fVar106 * -0.00019515296 + 0.008332161) * fVar106 + -0.16666655) + fVar101;
          auVar40._8_4_ =
               fVar107 * fVar102 *
               ((fVar107 * -0.00019515296 + 0.008332161) * fVar107 + -0.16666655) + fVar102;
          auVar40._12_4_ =
               fVar161 * fVar104 *
               ((fVar161 * -0.00019515296 + 0.008332161) * fVar161 + -0.16666655) + fVar104;
          auVar141 = vpand_avx(auVar276,auVar130);
          auVar141 = vpcmpeqd_avx(auVar141,_DAT_00592010);
          auVar167._0_4_ =
               (((fVar105 * 2.4433157e-05 + -0.0013887316) * fVar105 + 0.041666646) * fVar105 + -0.5
               ) * fVar105 + 1.0;
          auVar167._4_4_ =
               (((fVar106 * 2.4433157e-05 + -0.0013887316) * fVar106 + 0.041666646) * fVar106 + -0.5
               ) * fVar106 + 1.0;
          auVar167._8_4_ =
               (((fVar107 * 2.4433157e-05 + -0.0013887316) * fVar107 + 0.041666646) * fVar107 + -0.5
               ) * fVar107 + 1.0;
          auVar167._12_4_ =
               (((fVar161 * 2.4433157e-05 + -0.0013887316) * fVar161 + 0.041666646) * fVar161 + -0.5
               ) * fVar161 + 1.0;
          auVar141 = vblendvps_avx(auVar167,auVar40,auVar141);
          auVar130 = vpslld_avx(auVar130,0x1d);
          auVar130 = vpand_avx(auVar130,auVar209);
          *(undefined1 (*) [16])pfVar20 = auVar130 ^ auVar209 ^ auVar141;
          pfVar20 = pfVar20 + 4;
          uVar18 = uVar15 + 7;
          uVar15 = uVar15 + 4;
        }
        if ((int)uVar15 < iVar23) {
          uVar16 = CONCAT44(0,~uVar15 + iVar23);
          auVar41._8_8_ = 0;
          auVar41._0_8_ = uVar16;
          auVar110 = vpshufd_avx(auVar41,0x44);
          local_a0._16_16_ = auVar110;
          local_a0._0_16_ = auVar110;
          local_d0 = vpor_avx(auVar110,local_f0);
          local_e0 = vpor_avx(auVar110,local_f0);
          uVar25 = 0;
          auVar133 = _DAT_00594ae0;
          do {
            auVar42._8_8_ = 0;
            auVar42._0_8_ = uVar25;
            auVar110 = vpshufd_avx(auVar42,0x44);
            auVar60._16_16_ = auVar110;
            auVar60._0_16_ = auVar110;
            auVar57 = vorps_avx(auVar60,_DAT_00594ac0);
            auVar133 = vorps_avx(auVar60,auVar133);
            auVar130 = vpor_avx(local_a0._16_16_,local_f0);
            auVar110 = vpcmpgtq_avx(auVar133._16_16_ ^ local_f0,auVar130);
            auVar141 = vpcmpgtq_avx(auVar133._0_16_ ^ local_f0,local_d0);
            auVar110 = vpackssdw_avx(auVar141,auVar110);
            auVar204 = in_ZMM7._0_16_;
            auVar141 = vpcmpgtq_avx(auVar57._16_16_ ^ local_f0,auVar130);
            auVar131._0_4_ = auVar57._0_4_ ^ local_f0._0_4_;
            auVar131._4_4_ = auVar57._4_4_ ^ local_f0._4_4_;
            auVar131._8_4_ = auVar57._8_4_ ^ local_f0._8_4_;
            auVar131._12_4_ = auVar57._12_4_ ^ local_f0._12_4_;
            auVar130 = vpcmpgtq_avx(auVar131,local_e0);
            auVar141 = vpackssdw_avx(auVar130,auVar141);
            auVar110 = vpackssdw_avx(auVar141 ^ auVar204,auVar110 ^ auVar204);
            auVar141 = vpmovsxwd_avx(auVar110);
            auVar110 = vpunpckhwd_avx(auVar110,auVar110);
            local_80._16_16_ = auVar110;
            local_80._0_16_ = auVar141;
            local_120 = vmaskmovps_avx(local_80,*(undefined1 (*) [32])(pfVar20 + uVar25));
            local_150 = local_120._16_16_;
            local_160._0_4_ = cosf(local_120._16_4_);
            local_160._4_4_ = extraout_XMM0_Db_07;
            local_160._8_4_ = extraout_XMM0_Dc_07;
            local_160._12_4_ = extraout_XMM0_Dd_07;
            auVar110 = vmovshdup_avx(local_150);
            auVar89._0_4_ = cosf(auVar110._0_4_);
            auVar89._4_60_ = extraout_var_23;
            local_160 = vinsertps_avx(local_160,auVar89._0_16_,0x10);
            auVar110 = vpermilpd_avx(local_150,1);
            auVar90._0_4_ = cosf(auVar110._0_4_);
            auVar90._4_60_ = extraout_var_24;
            local_160 = vinsertps_avx(local_160,auVar90._0_16_,0x20);
            auVar110 = vpermilps_avx(local_150,0xff);
            auVar91._0_4_ = cosf(auVar110._0_4_);
            auVar91._4_60_ = extraout_var_25;
            local_150 = vinsertps_avx(local_160,auVar91._0_16_,0x30);
            local_160._0_4_ = cosf((float)local_120._0_4_);
            local_160._4_4_ = extraout_XMM0_Db_08;
            local_160._8_4_ = extraout_XMM0_Dc_08;
            local_160._12_4_ = extraout_XMM0_Dd_08;
            auVar110 = vmovshdup_avx(local_120._0_16_);
            auVar92._0_4_ = cosf(auVar110._0_4_);
            auVar92._4_60_ = extraout_var_26;
            local_160 = vinsertps_avx(local_160,auVar92._0_16_,0x10);
            auVar110 = vpermilpd_avx(local_120._0_16_,1);
            auVar93._0_4_ = cosf(auVar110._0_4_);
            auVar93._4_60_ = extraout_var_27;
            local_160 = vinsertps_avx(local_160,auVar93._0_16_,0x20);
            auVar110 = vpermilps_avx(local_120._0_16_,0xff);
            auVar94._0_4_ = cosf(auVar110._0_4_);
            auVar133 = _DAT_00594ae0;
            auVar94._4_60_ = extraout_var_28;
            auVar110 = vpcmpeqd_avx(auVar204,auVar204);
            in_ZMM7 = ZEXT1664(auVar110);
            auVar110 = vinsertps_avx(local_160,auVar94._0_16_,0x30);
            auVar61._16_16_ = local_150;
            auVar61._0_16_ = auVar110;
            auVar57 = vmaskmovps_avx(local_80,auVar61);
            *(undefined1 (*) [32])(pfVar20 + uVar25) = auVar57;
            uVar25 = uVar25 + 8;
          } while ((uVar16 + 8 & 0x1fffffff8) != uVar25);
        }
        local_138 = local_138 + 1;
      } while (local_138 != local_130);
    }
    break;
  case 0xb:
    local_60 = (long)bottom_top_blob->c;
    if (0 < local_60) {
      iVar23 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      local_130 = 0;
      local_f0._8_8_ = 0x8000000000000000;
      local_f0._0_8_ = 0x8000000000000000;
      local_138 = CONCAT44(local_138._4_4_,iVar23);
      do {
        pfVar20 = (float *)(local_128->cstep * local_130 * local_128->elemsize +
                           (long)local_128->data);
        iVar24 = (int)local_138;
        if (iVar23 < 8) {
          uVar15 = 0;
        }
        else {
          uVar18 = 0;
          do {
            local_c0 = *(undefined1 (*) [32])pfVar20;
            UnaryOp_x86_avx_functor::unary_op_tan::func_pack8(&local_161,(__m256 *)local_c0);
            *(undefined1 (*) [32])pfVar20 = local_c0;
            pfVar20 = pfVar20 + 8;
            uVar15 = uVar18 + 8;
            iVar23 = uVar18 + 0xf;
            uVar18 = uVar15;
          } while (iVar23 < iVar24);
        }
        auVar110 = in_ZMM5._0_16_;
        uVar18 = uVar15 | 3;
        while ((int)uVar18 < iVar24) {
          auVar103 = ZEXT856(*(ulong *)(pfVar20 + 2));
          in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
          local_c0._0_16_ = (undefined1  [16])*(__m128 *)pfVar20;
          afVar321 = UnaryOp_x86_avx_functor::unary_op_tan::func_pack4
                               (&local_161,(__m128 *)local_c0);
          auVar110 = in_ZMM5._0_16_;
          auVar64._0_8_ = afVar321._0_8_;
          auVar64._8_56_ = auVar103;
          local_c0._0_16_ = auVar64._0_16_;
          *(undefined1 (*) [16])pfVar20 = auVar64._0_16_;
          pfVar20 = pfVar20 + 4;
          uVar18 = uVar15 + 7;
          uVar15 = uVar15 + 4;
        }
        auVar110 = vpcmpeqd_avx(auVar110,auVar110);
        in_ZMM5 = ZEXT1664(auVar110);
        if ((int)uVar15 < iVar24) {
          uVar16 = CONCAT44(0,~uVar15 + (int)local_138);
          auVar30._8_8_ = 0;
          auVar30._0_8_ = uVar16;
          auVar141 = vpshufd_avx(auVar30,0x44);
          auVar110 = vpor_avx(auVar141,local_f0);
          local_a0._0_16_ = auVar110;
          local_d0 = vpor_avx(auVar141,local_f0);
          local_e0 = vpor_avx(auVar141,local_f0);
          uVar25 = 0;
          auVar133 = _DAT_00594ac0;
          auVar57 = _DAT_00594ae0;
          do {
            auVar31._8_8_ = 0;
            auVar31._0_8_ = uVar25;
            auVar110 = vpshufd_avx(auVar31,0x44);
            auVar49._16_16_ = auVar110;
            auVar49._0_16_ = auVar110;
            auVar133 = vorps_avx(auVar49,auVar133);
            auVar57 = vorps_avx(auVar49,auVar57);
            auVar110 = vpcmpgtq_avx(auVar57._16_16_ ^ local_f0,local_a0._0_16_);
            auVar141 = vpcmpgtq_avx(auVar57._0_16_ ^ local_f0,local_d0);
            auVar110 = vpackssdw_avx(auVar141,auVar110);
            auVar204 = in_ZMM5._0_16_;
            auVar141 = vpcmpgtq_avx(auVar133._16_16_ ^ local_f0,local_a0._0_16_);
            auVar116._0_4_ = auVar133._0_4_ ^ local_f0._0_4_;
            auVar116._4_4_ = auVar133._4_4_ ^ local_f0._4_4_;
            auVar116._8_4_ = auVar133._8_4_ ^ local_f0._8_4_;
            auVar116._12_4_ = auVar133._12_4_ ^ local_f0._12_4_;
            auVar130 = vpcmpgtq_avx(auVar116,local_e0);
            auVar141 = vpackssdw_avx(auVar130,auVar141);
            auVar110 = vpackssdw_avx(auVar141 ^ auVar204,auVar110 ^ auVar204);
            auVar141 = vpmovsxwd_avx(auVar110);
            auVar110 = vpunpckhwd_avx(auVar110,auVar110);
            local_80._16_16_ = auVar110;
            local_80._0_16_ = auVar141;
            local_120 = vmaskmovps_avx(local_80,*(undefined1 (*) [32])(pfVar20 + uVar25));
            local_150 = local_120._16_16_;
            local_160._0_4_ = tanf(local_120._16_4_);
            local_160._4_4_ = extraout_XMM0_Db;
            local_160._8_4_ = extraout_XMM0_Dc;
            local_160._12_4_ = extraout_XMM0_Dd;
            auVar110 = vmovshdup_avx(local_150);
            auVar65._0_4_ = tanf(auVar110._0_4_);
            auVar65._4_60_ = extraout_var;
            local_160 = vinsertps_avx(local_160,auVar65._0_16_,0x10);
            auVar110 = vpermilpd_avx(local_150,1);
            auVar66._0_4_ = tanf(auVar110._0_4_);
            auVar66._4_60_ = extraout_var_00;
            local_160 = vinsertps_avx(local_160,auVar66._0_16_,0x20);
            auVar110 = vpermilps_avx(local_150,0xff);
            auVar67._0_4_ = tanf(auVar110._0_4_);
            auVar67._4_60_ = extraout_var_01;
            local_150 = vinsertps_avx(local_160,auVar67._0_16_,0x30);
            local_160._0_4_ = tanf((float)local_120._0_4_);
            local_160._4_4_ = extraout_XMM0_Db_00;
            local_160._8_4_ = extraout_XMM0_Dc_00;
            local_160._12_4_ = extraout_XMM0_Dd_00;
            auVar110 = vmovshdup_avx(local_120._0_16_);
            auVar68._0_4_ = tanf(auVar110._0_4_);
            auVar68._4_60_ = extraout_var_02;
            local_160 = vinsertps_avx(local_160,auVar68._0_16_,0x10);
            auVar110 = vpermilpd_avx(local_120._0_16_,1);
            auVar69._0_4_ = tanf(auVar110._0_4_);
            auVar69._4_60_ = extraout_var_03;
            local_160 = vinsertps_avx(local_160,auVar69._0_16_,0x20);
            auVar110 = vpermilps_avx(local_120._0_16_,0xff);
            auVar70._0_4_ = tanf(auVar110._0_4_);
            auVar57 = _DAT_00594ae0;
            auVar133 = _DAT_00594ac0;
            auVar70._4_60_ = extraout_var_04;
            auVar110 = vpcmpeqd_avx(auVar204,auVar204);
            in_ZMM5 = ZEXT1664(auVar110);
            auVar110 = vinsertps_avx(local_160,auVar70._0_16_,0x30);
            auVar50._16_16_ = local_150;
            auVar50._0_16_ = auVar110;
            auVar56 = vmaskmovps_avx(local_80,auVar50);
            *(undefined1 (*) [32])(pfVar20 + uVar25) = auVar56;
            uVar25 = uVar25 + 8;
          } while ((uVar16 + 8 & 0x1fffffff8) != uVar25);
        }
        local_130 = local_130 + 1;
        iVar23 = (int)local_138;
      } while (local_130 != local_60);
    }
    break;
  case 0xc:
    local_120._0_8_ = (long)bottom_top_blob->c;
    if (0 < (long)bottom_top_blob->c) {
      uVar15 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      local_150._0_4_ = uVar15 & 0xfffffff8;
      lVar22 = 0;
      do {
        auVar300._8_4_ = 0x3f800000;
        auVar300._0_8_ = 0x3f8000003f800000;
        auVar281._8_4_ = 0x3f000000;
        auVar281._0_8_ = 0x3f0000003f000000;
        auVar256._8_4_ = 0x7fffffff;
        auVar256._0_8_ = 0x7fffffff7fffffff;
        auVar242._8_4_ = 0x80000000;
        auVar242._0_8_ = 0x8000000080000000;
        auVar300._12_4_ = 0x3f800000;
        auVar281._12_4_ = 0x3f000000;
        auVar256._12_4_ = 0x7fffffff;
        auVar242._12_4_ = 0x80000000;
        auVar300._16_4_ = 0x3f800000;
        auVar281._16_4_ = 0x3f000000;
        auVar256._16_4_ = 0x7fffffff;
        auVar242._16_4_ = 0x80000000;
        auVar300._20_4_ = 0x3f800000;
        auVar281._20_4_ = 0x3f000000;
        auVar256._20_4_ = 0x7fffffff;
        auVar242._20_4_ = 0x80000000;
        auVar300._24_4_ = 0x3f800000;
        auVar281._24_4_ = 0x3f000000;
        auVar256._24_4_ = 0x7fffffff;
        auVar242._24_4_ = 0x80000000;
        auVar300._28_4_ = 0x3f800000;
        auVar281._28_4_ = 0x3f000000;
        auVar256._28_4_ = 0x7fffffff;
        auVar242._28_4_ = 0x80000000;
        pauVar21 = (undefined1 (*) [32])
                   (local_128->cstep * lVar22 * local_128->elemsize + (long)local_128->data);
        if ((int)uVar15 < 8) {
          uVar18 = 0;
        }
        else {
          iVar23 = 7;
          do {
            auVar133 = vandps_avx(auVar256,*pauVar21);
            auVar160._0_4_ = auVar133._0_4_ * 0.5;
            auVar160._4_4_ = auVar133._4_4_ * 0.5;
            auVar160._8_4_ = auVar133._8_4_ * 0.5;
            auVar160._12_4_ = auVar133._12_4_ * 0.5;
            auVar160._16_4_ = auVar133._16_4_ * 0.5;
            auVar160._20_4_ = auVar133._20_4_ * 0.5;
            auVar160._28_36_ = in_ZMM2._28_36_;
            auVar160._24_4_ = auVar133._24_4_ * 0.5;
            auVar156 = vsubps_avx(auVar281,auVar160._0_32_);
            auVar57 = vrsqrtps_avx(auVar156);
            auVar56 = vcmpps_avx(auVar281,auVar133,1);
            fVar26 = auVar156._0_4_ * auVar57._0_4_;
            fVar101 = auVar156._4_4_ * auVar57._4_4_;
            fVar102 = auVar156._8_4_ * auVar57._8_4_;
            fVar104 = auVar156._12_4_ * auVar57._12_4_;
            fVar105 = auVar156._16_4_ * auVar57._16_4_;
            fVar106 = auVar156._20_4_ * auVar57._20_4_;
            fVar107 = auVar156._24_4_ * auVar57._24_4_;
            auVar5._4_4_ = fVar101 * -0.5 * (fVar101 * auVar57._4_4_ + -3.0);
            auVar5._0_4_ = fVar26 * -0.5 * (fVar26 * auVar57._0_4_ + -3.0);
            auVar5._8_4_ = fVar102 * -0.5 * (fVar102 * auVar57._8_4_ + -3.0);
            auVar5._12_4_ = fVar104 * -0.5 * (fVar104 * auVar57._12_4_ + -3.0);
            auVar5._16_4_ = fVar105 * -0.5 * (fVar105 * auVar57._16_4_ + -3.0);
            auVar5._20_4_ = fVar106 * -0.5 * (fVar106 * auVar57._20_4_ + -3.0);
            auVar5._24_4_ = fVar107 * -0.5 * (fVar107 * auVar57._24_4_ + -3.0);
            auVar5._28_4_ = auVar57._28_4_ + -3.0;
            auVar57 = vandps_avx(auVar256,auVar156);
            auVar211._8_4_ = 0x800000;
            auVar211._0_8_ = 0x80000000800000;
            auVar211._12_4_ = 0x800000;
            auVar211._16_4_ = 0x800000;
            auVar211._20_4_ = 0x800000;
            auVar211._24_4_ = 0x800000;
            auVar211._28_4_ = 0x800000;
            auVar57 = vcmpps_avx(auVar211,auVar57,2);
            auVar57 = vandps_avx(auVar57,auVar5);
            auVar57 = vblendvps_avx(auVar133,auVar57,auVar56);
            fVar26 = auVar57._0_4_;
            fVar161 = fVar26 * fVar26;
            fVar101 = auVar57._4_4_;
            fVar173 = fVar101 * fVar101;
            fVar102 = auVar57._8_4_;
            fVar175 = fVar102 * fVar102;
            fVar104 = auVar57._12_4_;
            fVar177 = fVar104 * fVar104;
            fVar105 = auVar57._16_4_;
            fVar196 = fVar105 * fVar105;
            fVar106 = auVar57._20_4_;
            fVar198 = fVar106 * fVar106;
            fVar107 = auVar57._24_4_;
            fVar200 = fVar107 * fVar107;
            fVar202 = fVar161 * fVar161;
            fVar213 = fVar173 * fVar173;
            fVar214 = fVar175 * fVar175;
            fVar215 = fVar177 * fVar177;
            fVar216 = fVar196 * fVar196;
            fVar217 = fVar198 * fVar198;
            fVar218 = fVar200 * fVar200;
            auVar133 = vandps_avx(auVar300,auVar56);
            fVar172 = auVar133._0_4_ * 1.5707964;
            fVar174 = auVar133._4_4_ * 1.5707964;
            fVar176 = auVar133._8_4_ * 1.5707964;
            fVar178 = auVar133._12_4_ * 1.5707964;
            fVar197 = auVar133._16_4_ * 1.5707964;
            fVar199 = auVar133._20_4_ * 1.5707964;
            fVar201 = auVar133._24_4_ * 1.5707964;
            in_ZMM2 = ZEXT3264(CONCAT428(0x3fc90fdb,
                                         CONCAT424(fVar201,CONCAT420(fVar199,CONCAT416(fVar197,
                                                  CONCAT412(fVar178,CONCAT48(fVar176,CONCAT44(
                                                  fVar174,fVar172))))))));
            auVar137._0_4_ =
                 (auVar133._0_4_ * -3.0 + 1.0) * fVar26 *
                 ((fVar202 * 0.023994016 + 0.07494697) * fVar202 + 1.0 +
                 ((fVar202 * 0.042417344 + 0.045520633) * fVar202 + 0.16666782) * fVar161) + fVar172
            ;
            auVar137._4_4_ =
                 (auVar133._4_4_ * -3.0 + 1.0) * fVar101 *
                 ((fVar213 * 0.023994016 + 0.07494697) * fVar213 + 1.0 +
                 ((fVar213 * 0.042417344 + 0.045520633) * fVar213 + 0.16666782) * fVar173) + fVar174
            ;
            auVar137._8_4_ =
                 (auVar133._8_4_ * -3.0 + 1.0) * fVar102 *
                 ((fVar214 * 0.023994016 + 0.07494697) * fVar214 + 1.0 +
                 ((fVar214 * 0.042417344 + 0.045520633) * fVar214 + 0.16666782) * fVar175) + fVar176
            ;
            auVar137._12_4_ =
                 (auVar133._12_4_ * -3.0 + 1.0) * fVar104 *
                 ((fVar215 * 0.023994016 + 0.07494697) * fVar215 + 1.0 +
                 ((fVar215 * 0.042417344 + 0.045520633) * fVar215 + 0.16666782) * fVar177) + fVar178
            ;
            auVar137._16_4_ =
                 (auVar133._16_4_ * -3.0 + 1.0) * fVar105 *
                 ((fVar216 * 0.023994016 + 0.07494697) * fVar216 + 1.0 +
                 ((fVar216 * 0.042417344 + 0.045520633) * fVar216 + 0.16666782) * fVar196) + fVar197
            ;
            auVar137._20_4_ =
                 (auVar133._20_4_ * -3.0 + 1.0) * fVar106 *
                 ((fVar217 * 0.023994016 + 0.07494697) * fVar217 + 1.0 +
                 ((fVar217 * 0.042417344 + 0.045520633) * fVar217 + 0.16666782) * fVar198) + fVar199
            ;
            auVar137._24_4_ =
                 (auVar133._24_4_ * -3.0 + 1.0) * fVar107 *
                 ((fVar218 * 0.023994016 + 0.07494697) * fVar218 + 1.0 +
                 ((fVar218 * 0.042417344 + 0.045520633) * fVar218 + 0.16666782) * fVar200) + fVar201
            ;
            auVar137._28_4_ = auVar57._28_4_ + 1.5707964;
            auVar133 = vandps_avx(auVar242,*pauVar21);
            auVar133 = vorps_avx(auVar133,auVar137);
            *pauVar21 = auVar133;
            pauVar21 = pauVar21 + 1;
            iVar23 = iVar23 + 8;
          } while (iVar23 < (int)uVar15);
          uVar18 = local_150._0_4_;
        }
        auVar249._8_4_ = 0x7fffffff;
        auVar249._0_8_ = 0x7fffffff7fffffff;
        auVar249._12_4_ = 0x7fffffff;
        auVar264._8_4_ = 0x3f000000;
        auVar264._0_8_ = 0x3f0000003f000000;
        auVar264._12_4_ = 0x3f000000;
        auVar291._8_4_ = 0x3f800000;
        auVar291._0_8_ = 0x3f8000003f800000;
        auVar291._12_4_ = 0x3f800000;
        auVar313._8_4_ = 0x800000;
        auVar313._0_8_ = 0x80000000800000;
        auVar313._12_4_ = 0x800000;
        uVar17 = uVar18 | 3;
        while ((int)uVar17 < (int)uVar15) {
          auVar110 = vandps_avx(auVar249,*(undefined1 (*) [16])*pauVar21);
          auVar130 = vcmpps_avx(auVar264,auVar110,1);
          auVar164._0_4_ = auVar110._0_4_ * 0.5;
          auVar164._4_4_ = auVar110._4_4_ * 0.5;
          auVar164._8_4_ = auVar110._8_4_ * 0.5;
          auVar164._12_4_ = auVar110._12_4_ * 0.5;
          auVar204 = vsubps_avx(auVar264,auVar164);
          auVar141 = vrsqrtps_avx(auVar204);
          fVar26 = auVar204._0_4_ * auVar141._0_4_;
          fVar101 = auVar204._4_4_ * auVar141._4_4_;
          fVar102 = auVar204._8_4_ * auVar141._8_4_;
          fVar104 = auVar204._12_4_ * auVar141._12_4_;
          auVar183._0_4_ = fVar26 * -0.5 * (fVar26 * auVar141._0_4_ + -3.0);
          auVar183._4_4_ = fVar101 * -0.5 * (fVar101 * auVar141._4_4_ + -3.0);
          auVar183._8_4_ = fVar102 * -0.5 * (fVar102 * auVar141._8_4_ + -3.0);
          auVar183._12_4_ = fVar104 * -0.5 * (fVar104 * auVar141._12_4_ + -3.0);
          auVar141 = vandps_avx(auVar249,auVar204);
          auVar141 = vcmpps_avx(auVar313,auVar141,2);
          auVar141 = vandps_avx(auVar141,auVar183);
          auVar110 = vblendvps_avx(auVar110,auVar141,auVar130);
          fVar26 = auVar110._0_4_;
          fVar105 = fVar26 * fVar26;
          fVar101 = auVar110._4_4_;
          fVar106 = fVar101 * fVar101;
          fVar102 = auVar110._8_4_;
          fVar107 = fVar102 * fVar102;
          fVar104 = auVar110._12_4_;
          fVar161 = fVar104 * fVar104;
          fVar172 = fVar105 * fVar105;
          fVar173 = fVar106 * fVar106;
          fVar174 = fVar107 * fVar107;
          fVar175 = fVar161 * fVar161;
          auVar110 = vandps_avx(auVar291,auVar130);
          auVar117._0_4_ =
               (auVar110._0_4_ * -3.0 + 1.0) * fVar26 *
               ((fVar172 * 0.023994016 + 0.07494697) * fVar172 + 1.0 +
               ((fVar172 * 0.042417344 + 0.045520633) * fVar172 + 0.16666782) * fVar105) +
               auVar110._0_4_ * 1.5707964;
          auVar117._4_4_ =
               (auVar110._4_4_ * -3.0 + 1.0) * fVar101 *
               ((fVar173 * 0.023994016 + 0.07494697) * fVar173 + 1.0 +
               ((fVar173 * 0.042417344 + 0.045520633) * fVar173 + 0.16666782) * fVar106) +
               auVar110._4_4_ * 1.5707964;
          auVar117._8_4_ =
               (auVar110._8_4_ * -3.0 + 1.0) * fVar102 *
               ((fVar174 * 0.023994016 + 0.07494697) * fVar174 + 1.0 +
               ((fVar174 * 0.042417344 + 0.045520633) * fVar174 + 0.16666782) * fVar107) +
               auVar110._8_4_ * 1.5707964;
          auVar117._12_4_ =
               (auVar110._12_4_ * -3.0 + 1.0) * fVar104 *
               ((fVar175 * 0.023994016 + 0.07494697) * fVar175 + 1.0 +
               ((fVar175 * 0.042417344 + 0.045520633) * fVar175 + 0.16666782) * fVar161) +
               auVar110._12_4_ * 1.5707964;
          auVar145._8_4_ = 0x80000000;
          auVar145._0_8_ = 0x8000000080000000;
          auVar145._12_4_ = 0x80000000;
          in_ZMM2 = ZEXT1664(auVar145);
          auVar110 = vandps_avx(*(undefined1 (*) [16])*pauVar21,auVar145);
          auVar110 = vorps_avx(auVar110,auVar117);
          *(undefined1 (*) [16])*pauVar21 = auVar110;
          pauVar21 = (undefined1 (*) [32])(*pauVar21 + 0x10);
          uVar17 = uVar18 + 7;
          uVar18 = uVar18 + 4;
        }
        if (uVar15 - uVar18 != 0 && (int)uVar18 <= (int)uVar15) {
          lVar19 = 0;
          do {
            in_ZMM2 = ZEXT1664(in_ZMM2._0_16_);
            fVar26 = asinf(*(float *)(*pauVar21 + lVar19 * 4));
            *(float *)(*pauVar21 + lVar19 * 4) = fVar26;
            lVar19 = lVar19 + 1;
          } while (uVar15 - uVar18 != (int)lVar19);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != local_120._0_8_);
    }
    break;
  case 0xd:
    local_120._0_8_ = (long)bottom_top_blob->c;
    if (0 < (long)bottom_top_blob->c) {
      uVar15 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      local_150._0_4_ = uVar15 & 0xfffffff8;
      lVar22 = 0;
      do {
        auVar286._8_4_ = 0x3f000000;
        auVar286._0_8_ = 0x3f0000003f000000;
        auVar258._8_4_ = 0x7fffffff;
        auVar258._0_8_ = 0x7fffffff7fffffff;
        auVar247._8_4_ = 0x80000000;
        auVar247._0_8_ = 0x8000000080000000;
        auVar140._8_4_ = 0x3d2dbdcf;
        auVar140._0_8_ = 0x3d2dbdcf3d2dbdcf;
        auVar58._8_4_ = 0x800000;
        auVar58._0_8_ = 0x80000000800000;
        auVar286._12_4_ = 0x3f000000;
        auVar258._12_4_ = 0x7fffffff;
        auVar247._12_4_ = 0x80000000;
        auVar140._12_4_ = 0x3d2dbdcf;
        auVar58._12_4_ = 0x800000;
        auVar286._16_4_ = 0x3f000000;
        auVar258._16_4_ = 0x7fffffff;
        auVar247._16_4_ = 0x80000000;
        auVar140._16_4_ = 0x3d2dbdcf;
        auVar58._16_4_ = 0x800000;
        auVar286._20_4_ = 0x3f000000;
        auVar258._20_4_ = 0x7fffffff;
        auVar247._20_4_ = 0x80000000;
        auVar140._20_4_ = 0x3d2dbdcf;
        auVar58._20_4_ = 0x800000;
        auVar286._24_4_ = 0x3f000000;
        auVar258._24_4_ = 0x7fffffff;
        auVar247._24_4_ = 0x80000000;
        auVar140._24_4_ = 0x3d2dbdcf;
        auVar58._24_4_ = 0x800000;
        auVar286._28_4_ = 0x3f000000;
        auVar258._28_4_ = 0x7fffffff;
        auVar247._28_4_ = 0x80000000;
        auVar140._28_4_ = 0x3d2dbdcf;
        auVar58._28_4_ = 0x800000;
        pauVar21 = (undefined1 (*) [32])
                   (local_128->cstep * lVar22 * local_128->elemsize + (long)local_128->data);
        if ((int)uVar15 < 8) {
          uVar18 = 0;
        }
        else {
          iVar23 = 7;
          do {
            auVar133 = *pauVar21;
            auVar57 = vandps_avx(auVar258,auVar133);
            auVar14._4_4_ = auVar57._4_4_ * 0.5;
            auVar14._0_4_ = auVar57._0_4_ * 0.5;
            auVar14._8_4_ = auVar57._8_4_ * 0.5;
            auVar14._12_4_ = auVar57._12_4_ * 0.5;
            auVar14._16_4_ = auVar57._16_4_ * 0.5;
            auVar14._20_4_ = auVar57._20_4_ * 0.5;
            auVar14._24_4_ = auVar57._24_4_ * 0.5;
            auVar14._28_4_ = auVar140._28_4_;
            auVar156 = vsubps_avx(auVar286,auVar14);
            auVar56 = vrsqrtps_avx(auVar156);
            auVar140 = vcmpps_avx(auVar286,auVar57,1);
            fVar26 = auVar156._0_4_ * auVar56._0_4_;
            fVar101 = auVar156._4_4_ * auVar56._4_4_;
            fVar102 = auVar156._8_4_ * auVar56._8_4_;
            fVar104 = auVar156._12_4_ * auVar56._12_4_;
            fVar105 = auVar156._16_4_ * auVar56._16_4_;
            fVar106 = auVar156._20_4_ * auVar56._20_4_;
            fVar107 = auVar156._24_4_ * auVar56._24_4_;
            auVar10._4_4_ = fVar101 * -0.5 * (fVar101 * auVar56._4_4_ + -3.0);
            auVar10._0_4_ = fVar26 * -0.5 * (fVar26 * auVar56._0_4_ + -3.0);
            auVar10._8_4_ = fVar102 * -0.5 * (fVar102 * auVar56._8_4_ + -3.0);
            auVar10._12_4_ = fVar104 * -0.5 * (fVar104 * auVar56._12_4_ + -3.0);
            auVar10._16_4_ = fVar105 * -0.5 * (fVar105 * auVar56._16_4_ + -3.0);
            auVar10._20_4_ = fVar106 * -0.5 * (fVar106 * auVar56._20_4_ + -3.0);
            auVar10._24_4_ = fVar107 * -0.5 * (fVar107 * auVar56._24_4_ + -3.0);
            auVar10._28_4_ = auVar56._28_4_ + -3.0;
            auVar56 = vandps_avx(auVar258,auVar156);
            auVar56 = vcmpps_avx(auVar58,auVar56,2);
            auVar56 = vandps_avx(auVar56,auVar10);
            auVar56 = vblendvps_avx(auVar57,auVar56,auVar140);
            fVar26 = auVar56._0_4_;
            fVar161 = fVar26 * fVar26;
            fVar101 = auVar56._4_4_;
            fVar172 = fVar101 * fVar101;
            fVar102 = auVar56._8_4_;
            fVar173 = fVar102 * fVar102;
            fVar104 = auVar56._12_4_;
            fVar174 = fVar104 * fVar104;
            fVar105 = auVar56._16_4_;
            fVar175 = fVar105 * fVar105;
            fVar106 = auVar56._20_4_;
            fVar176 = fVar106 * fVar106;
            fVar107 = auVar56._24_4_;
            fVar177 = fVar107 * fVar107;
            fVar178 = fVar161 * fVar161;
            fVar196 = fVar172 * fVar172;
            fVar197 = fVar173 * fVar173;
            fVar198 = fVar174 * fVar174;
            fVar199 = fVar175 * fVar175;
            fVar200 = fVar176 * fVar176;
            fVar201 = fVar177 * fVar177;
            auVar57 = vandps_avx(auVar247,auVar133);
            fVar26 = ((fVar178 * 0.023994016 + 0.07494697) * fVar178 + 1.0 +
                     ((fVar178 * 0.042417344 + 0.045520633) * fVar178 + 0.16666782) * fVar161) *
                     fVar26;
            fVar101 = ((fVar196 * 0.023994016 + 0.07494697) * fVar196 + 1.0 +
                      ((fVar196 * 0.042417344 + 0.045520633) * fVar196 + 0.16666782) * fVar172) *
                      fVar101;
            auVar11._4_4_ = fVar101;
            auVar11._0_4_ = fVar26;
            fVar102 = ((fVar197 * 0.023994016 + 0.07494697) * fVar197 + 1.0 +
                      ((fVar197 * 0.042417344 + 0.045520633) * fVar197 + 0.16666782) * fVar173) *
                      fVar102;
            auVar11._8_4_ = fVar102;
            fVar104 = ((fVar198 * 0.023994016 + 0.07494697) * fVar198 + 1.0 +
                      ((fVar198 * 0.042417344 + 0.045520633) * fVar198 + 0.16666782) * fVar174) *
                      fVar104;
            auVar11._12_4_ = fVar104;
            fVar105 = ((fVar199 * 0.023994016 + 0.07494697) * fVar199 + 1.0 +
                      ((fVar199 * 0.042417344 + 0.045520633) * fVar199 + 0.16666782) * fVar175) *
                      fVar105;
            auVar11._16_4_ = fVar105;
            fVar106 = ((fVar200 * 0.023994016 + 0.07494697) * fVar200 + 1.0 +
                      ((fVar200 * 0.042417344 + 0.045520633) * fVar200 + 0.16666782) * fVar176) *
                      fVar106;
            auVar11._20_4_ = fVar106;
            fVar161 = auVar56._28_4_;
            fVar107 = ((fVar201 * 0.023994016 + 0.07494697) * fVar201 + 1.0 +
                      ((fVar201 * 0.042417344 + 0.045520633) * fVar201 + 0.16666782) * fVar177) *
                      fVar107;
            auVar11._24_4_ = fVar107;
            auVar11._28_4_ = fVar161;
            auVar56 = vorps_avx(auVar57,auVar11);
            auVar158._0_4_ = fVar26 + fVar26;
            auVar158._4_4_ = fVar101 + fVar101;
            auVar158._8_4_ = fVar102 + fVar102;
            auVar158._12_4_ = fVar104 + fVar104;
            auVar158._16_4_ = fVar105 + fVar105;
            auVar158._20_4_ = fVar106 + fVar106;
            auVar158._24_4_ = fVar107 + fVar107;
            auVar158._28_4_ = fVar161 + fVar161;
            auVar57 = vorps_avx(auVar57,auVar158);
            auVar133 = vcmpps_avx(auVar133,ZEXT1232(ZEXT812(0)) << 0x20,1);
            auVar195._8_4_ = 0x40490fdb;
            auVar195._0_8_ = 0x40490fdb40490fdb;
            auVar195._12_4_ = 0x40490fdb;
            auVar195._16_4_ = 0x40490fdb;
            auVar195._20_4_ = 0x40490fdb;
            auVar195._24_4_ = 0x40490fdb;
            auVar195._28_4_ = 0x40490fdb;
            auVar133 = vandps_avx(auVar133,auVar195);
            auVar59._0_4_ = auVar133._0_4_ + auVar57._0_4_;
            auVar59._4_4_ = auVar133._4_4_ + auVar57._4_4_;
            auVar59._8_4_ = auVar133._8_4_ + auVar57._8_4_;
            auVar59._12_4_ = auVar133._12_4_ + auVar57._12_4_;
            auVar59._16_4_ = auVar133._16_4_ + auVar57._16_4_;
            auVar59._20_4_ = auVar133._20_4_ + auVar57._20_4_;
            auVar59._24_4_ = auVar133._24_4_ + auVar57._24_4_;
            auVar59._28_4_ = auVar133._28_4_ + auVar57._28_4_;
            auVar159._8_4_ = 0x3fc90fdb;
            auVar159._0_8_ = 0x3fc90fdb3fc90fdb;
            auVar159._12_4_ = 0x3fc90fdb;
            auVar159._16_4_ = 0x3fc90fdb;
            auVar159._20_4_ = 0x3fc90fdb;
            auVar159._24_4_ = 0x3fc90fdb;
            auVar159._28_4_ = 0x3fc90fdb;
            auVar133 = vsubps_avx(auVar159,auVar56);
            auVar133 = vblendvps_avx(auVar133,auVar59,auVar140);
            *pauVar21 = auVar133;
            pauVar21 = pauVar21 + 1;
            iVar23 = iVar23 + 8;
          } while (iVar23 < (int)uVar15);
          uVar18 = local_150._0_4_;
        }
        auVar252._8_4_ = 0x7fffffff;
        auVar252._0_8_ = 0x7fffffff7fffffff;
        auVar252._12_4_ = 0x7fffffff;
        auVar273._8_4_ = 0x3f000000;
        auVar273._0_8_ = 0x3f0000003f000000;
        auVar273._12_4_ = 0x3f000000;
        auVar297._8_4_ = 0x3fc90fdb;
        auVar297._0_8_ = 0x3fc90fdb3fc90fdb;
        auVar297._12_4_ = 0x3fc90fdb;
        auVar312._8_4_ = 0x40490fdb;
        auVar312._0_8_ = 0x40490fdb40490fdb;
        auVar312._12_4_ = 0x40490fdb;
        uVar17 = uVar18 | 3;
        while ((int)uVar17 < (int)uVar15) {
          auVar110 = *(undefined1 (*) [16])*pauVar21;
          auVar141 = vandps_avx(auVar252,auVar110);
          auVar204 = vcmpps_avx(auVar273,auVar141,1);
          auVar166._0_4_ = auVar141._0_4_ * 0.5;
          auVar166._4_4_ = auVar141._4_4_ * 0.5;
          auVar166._8_4_ = auVar141._8_4_ * 0.5;
          auVar166._12_4_ = auVar141._12_4_ * 0.5;
          auVar295 = vsubps_avx(auVar273,auVar166);
          auVar130 = vrsqrtps_avx(auVar295);
          fVar26 = auVar295._0_4_ * auVar130._0_4_;
          fVar101 = auVar295._4_4_ * auVar130._4_4_;
          fVar102 = auVar295._8_4_ * auVar130._8_4_;
          fVar104 = auVar295._12_4_ * auVar130._12_4_;
          auVar191._0_4_ = fVar26 * -0.5 * (fVar26 * auVar130._0_4_ + -3.0);
          auVar191._4_4_ = fVar101 * -0.5 * (fVar101 * auVar130._4_4_ + -3.0);
          auVar191._8_4_ = fVar102 * -0.5 * (fVar102 * auVar130._8_4_ + -3.0);
          auVar191._12_4_ = fVar104 * -0.5 * (fVar104 * auVar130._12_4_ + -3.0);
          auVar130 = vandps_avx(auVar252,auVar295);
          auVar208._8_4_ = 0x800000;
          auVar208._0_8_ = 0x80000000800000;
          auVar208._12_4_ = 0x800000;
          auVar130 = vcmpps_avx(auVar208,auVar130,2);
          auVar130 = vandps_avx(auVar130,auVar191);
          auVar141 = vblendvps_avx(auVar141,auVar130,auVar204);
          fVar26 = auVar141._0_4_;
          fVar105 = fVar26 * fVar26;
          fVar101 = auVar141._4_4_;
          fVar106 = fVar101 * fVar101;
          fVar102 = auVar141._8_4_;
          fVar107 = fVar102 * fVar102;
          fVar104 = auVar141._12_4_;
          fVar161 = fVar104 * fVar104;
          fVar172 = fVar105 * fVar105;
          fVar173 = fVar106 * fVar106;
          fVar174 = fVar107 * fVar107;
          fVar175 = fVar161 * fVar161;
          auVar192._8_4_ = 0x80000000;
          auVar192._0_8_ = 0x8000000080000000;
          auVar192._12_4_ = 0x80000000;
          auVar141 = vandps_avx(auVar110,auVar192);
          auVar152._0_4_ =
               ((fVar172 * 0.023994016 + 0.07494697) * fVar172 + 1.0 +
               ((fVar172 * 0.042417344 + 0.045520633) * fVar172 + 0.16666782) * fVar105) * fVar26;
          auVar152._4_4_ =
               ((fVar173 * 0.023994016 + 0.07494697) * fVar173 + 1.0 +
               ((fVar173 * 0.042417344 + 0.045520633) * fVar173 + 0.16666782) * fVar106) * fVar101;
          auVar152._8_4_ =
               ((fVar174 * 0.023994016 + 0.07494697) * fVar174 + 1.0 +
               ((fVar174 * 0.042417344 + 0.045520633) * fVar174 + 0.16666782) * fVar107) * fVar102;
          auVar152._12_4_ =
               ((fVar175 * 0.023994016 + 0.07494697) * fVar175 + 1.0 +
               ((fVar175 * 0.042417344 + 0.045520633) * fVar175 + 0.16666782) * fVar161) * fVar104;
          auVar130 = vorps_avx(auVar141,auVar152);
          auVar153._0_4_ = auVar152._0_4_ + auVar152._0_4_;
          auVar153._4_4_ = auVar152._4_4_ + auVar152._4_4_;
          auVar153._8_4_ = auVar152._8_4_ + auVar152._8_4_;
          auVar153._12_4_ = auVar152._12_4_ + auVar152._12_4_;
          auVar141 = vorps_avx(auVar141,auVar153);
          auVar110 = vcmpps_avx(auVar110,ZEXT816(0) << 0x20,1);
          auVar110 = vandps_avx(auVar312,auVar110);
          auVar128._0_4_ = auVar110._0_4_ + auVar141._0_4_;
          auVar128._4_4_ = auVar110._4_4_ + auVar141._4_4_;
          auVar128._8_4_ = auVar110._8_4_ + auVar141._8_4_;
          auVar128._12_4_ = auVar110._12_4_ + auVar141._12_4_;
          auVar110 = vsubps_avx(auVar297,auVar130);
          auVar110 = vblendvps_avx(auVar110,auVar128,auVar204);
          *(undefined1 (*) [16])*pauVar21 = auVar110;
          pauVar21 = (undefined1 (*) [32])(*pauVar21 + 0x10);
          uVar17 = uVar18 + 7;
          uVar18 = uVar18 + 4;
        }
        if (uVar15 - uVar18 != 0 && (int)uVar18 <= (int)uVar15) {
          lVar19 = 0;
          do {
            fVar26 = acosf(*(float *)(*pauVar21 + lVar19 * 4));
            *(float *)(*pauVar21 + lVar19 * 4) = fVar26;
            lVar19 = lVar19 + 1;
          } while (uVar15 - uVar18 != (int)lVar19);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != local_120._0_8_);
    }
    break;
  case 0xe:
    local_120._0_8_ = (long)bottom_top_blob->c;
    if (0 < (long)bottom_top_blob->c) {
      uVar15 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      local_150._0_4_ = uVar15 & 0xfffffff8;
      lVar22 = 0;
      do {
        auVar280._8_4_ = 0x3f800000;
        auVar280._0_8_ = 0x3f8000003f800000;
        auVar255._8_4_ = 0x7fffffff;
        auVar255._0_8_ = 0x7fffffff7fffffff;
        auVar239._8_4_ = 0x80000000;
        auVar239._0_8_ = 0x8000000080000000;
        auVar169._8_4_ = 0xbf800000;
        auVar169._0_8_ = 0xbf800000bf800000;
        auVar280._12_4_ = 0x3f800000;
        auVar255._12_4_ = 0x7fffffff;
        auVar239._12_4_ = 0x80000000;
        auVar169._12_4_ = 0xbf800000;
        auVar280._16_4_ = 0x3f800000;
        auVar255._16_4_ = 0x7fffffff;
        auVar239._16_4_ = 0x80000000;
        auVar169._16_4_ = 0xbf800000;
        auVar280._20_4_ = 0x3f800000;
        auVar255._20_4_ = 0x7fffffff;
        auVar239._20_4_ = 0x80000000;
        auVar169._20_4_ = 0xbf800000;
        auVar280._24_4_ = 0x3f800000;
        auVar255._24_4_ = 0x7fffffff;
        auVar239._24_4_ = 0x80000000;
        auVar169._24_4_ = 0xbf800000;
        auVar280._28_4_ = 0x3f800000;
        auVar255._28_4_ = 0x7fffffff;
        auVar239._28_4_ = 0x80000000;
        auVar169._28_4_ = 0xbf800000;
        pauVar21 = (undefined1 (*) [32])
                   (local_128->cstep * lVar22 * local_128->elemsize + (long)local_128->data);
        if ((int)uVar15 < 8) {
          uVar18 = 0;
        }
        else {
          iVar23 = 7;
          do {
            auVar133 = vandps_avx(auVar255,*pauVar21);
            auVar56 = vcmpps_avx(auVar280,auVar133,1);
            auVar57 = vblendvps_avx(auVar133,auVar169,auVar56);
            auVar133 = vmaxps_avx(auVar280,auVar133);
            auVar156 = vrcpps_avx(auVar133);
            fVar26 = auVar57._0_4_ * auVar156._0_4_;
            fVar101 = auVar57._4_4_ * auVar156._4_4_;
            fVar102 = auVar57._8_4_ * auVar156._8_4_;
            fVar104 = auVar57._12_4_ * auVar156._12_4_;
            fVar105 = auVar57._16_4_ * auVar156._16_4_;
            fVar106 = auVar57._20_4_ * auVar156._20_4_;
            fVar107 = auVar57._24_4_ * auVar156._24_4_;
            auVar2._4_4_ = auVar133._4_4_ * fVar101;
            auVar2._0_4_ = auVar133._0_4_ * fVar26;
            auVar2._8_4_ = auVar133._8_4_ * fVar102;
            auVar2._12_4_ = auVar133._12_4_ * fVar104;
            auVar2._16_4_ = auVar133._16_4_ * fVar105;
            auVar2._20_4_ = auVar133._20_4_ * fVar106;
            auVar2._24_4_ = auVar133._24_4_ * fVar107;
            auVar2._28_4_ = auVar133._28_4_;
            auVar57 = vsubps_avx(auVar57,auVar2);
            fVar26 = fVar26 + auVar156._0_4_ * auVar57._0_4_;
            fVar101 = fVar101 + auVar156._4_4_ * auVar57._4_4_;
            fVar102 = fVar102 + auVar156._8_4_ * auVar57._8_4_;
            fVar104 = fVar104 + auVar156._12_4_ * auVar57._12_4_;
            fVar105 = fVar105 + auVar156._16_4_ * auVar57._16_4_;
            fVar106 = fVar106 + auVar156._20_4_ * auVar57._20_4_;
            fVar107 = fVar107 + auVar156._24_4_ * auVar57._24_4_;
            fVar219 = in_ZMM5._28_4_;
            fVar161 = fVar26 * fVar26;
            fVar172 = fVar101 * fVar101;
            fVar173 = fVar102 * fVar102;
            fVar174 = fVar104 * fVar104;
            fVar175 = fVar105 * fVar105;
            fVar176 = fVar106 * fVar106;
            fVar177 = fVar107 * fVar107;
            fVar178 = fVar161 * fVar161;
            fVar196 = fVar172 * fVar172;
            fVar197 = fVar173 * fVar173;
            fVar198 = fVar174 * fVar174;
            fVar199 = fVar175 * fVar175;
            fVar200 = fVar176 * fVar176;
            fVar201 = fVar177 * fVar177;
            fVar202 = ((fVar178 * -0.01606863 + -0.07504295) * fVar178 + -0.14203644) * fVar178 +
                      -0.33333072;
            fVar213 = ((fVar196 * -0.01606863 + -0.07504295) * fVar196 + -0.14203644) * fVar196 +
                      -0.33333072;
            fVar214 = ((fVar197 * -0.01606863 + -0.07504295) * fVar197 + -0.14203644) * fVar197 +
                      -0.33333072;
            fVar215 = ((fVar198 * -0.01606863 + -0.07504295) * fVar198 + -0.14203644) * fVar198 +
                      -0.33333072;
            fVar216 = ((fVar199 * -0.01606863 + -0.07504295) * fVar199 + -0.14203644) * fVar199 +
                      -0.33333072;
            fVar217 = ((fVar200 * -0.01606863 + -0.07504295) * fVar200 + -0.14203644) * fVar200 +
                      -0.33333072;
            fVar218 = ((fVar201 * -0.01606863 + -0.07504295) * fVar201 + -0.14203644) * fVar201 +
                      -0.33333072;
            in_ZMM5 = ZEXT3264(CONCAT428(fVar219 + -0.07504295 + -0.14203644 + -0.33333072,
                                         CONCAT424(fVar218,CONCAT420(fVar217,CONCAT416(fVar216,
                                                  CONCAT412(fVar215,CONCAT48(fVar214,CONCAT44(
                                                  fVar213,fVar202))))))));
            auVar170._8_4_ = 0x3fc90fdb;
            auVar170._0_8_ = 0x3fc90fdb3fc90fdb;
            auVar170._12_4_ = 0x3fc90fdb;
            auVar170._16_4_ = 0x3fc90fdb;
            auVar170._20_4_ = 0x3fc90fdb;
            auVar170._24_4_ = 0x3fc90fdb;
            auVar170._28_4_ = 0x3fc90fdb;
            auVar133 = vandps_avx(auVar56,auVar170);
            auVar136._0_4_ =
                 ((((fVar178 * 0.0028498897 + 0.04269152) * fVar178 + 0.10640934) * fVar178 +
                  0.1999262) * fVar178 + 1.0 + fVar202 * fVar161) * fVar26 + auVar133._0_4_;
            auVar136._4_4_ =
                 ((((fVar196 * 0.0028498897 + 0.04269152) * fVar196 + 0.10640934) * fVar196 +
                  0.1999262) * fVar196 + 1.0 + fVar213 * fVar172) * fVar101 + auVar133._4_4_;
            auVar136._8_4_ =
                 ((((fVar197 * 0.0028498897 + 0.04269152) * fVar197 + 0.10640934) * fVar197 +
                  0.1999262) * fVar197 + 1.0 + fVar214 * fVar173) * fVar102 + auVar133._8_4_;
            auVar136._12_4_ =
                 ((((fVar198 * 0.0028498897 + 0.04269152) * fVar198 + 0.10640934) * fVar198 +
                  0.1999262) * fVar198 + 1.0 + fVar215 * fVar174) * fVar104 + auVar133._12_4_;
            auVar136._16_4_ =
                 ((((fVar199 * 0.0028498897 + 0.04269152) * fVar199 + 0.10640934) * fVar199 +
                  0.1999262) * fVar199 + 1.0 + fVar216 * fVar175) * fVar105 + auVar133._16_4_;
            auVar136._20_4_ =
                 ((((fVar200 * 0.0028498897 + 0.04269152) * fVar200 + 0.10640934) * fVar200 +
                  0.1999262) * fVar200 + 1.0 + fVar217 * fVar176) * fVar106 + auVar133._20_4_;
            auVar136._24_4_ =
                 ((((fVar201 * 0.0028498897 + 0.04269152) * fVar201 + 0.10640934) * fVar201 +
                  0.1999262) * fVar201 + 1.0 + fVar218 * fVar177) * fVar107 + auVar133._24_4_;
            auVar136._28_4_ = fVar219 + auVar57._28_4_ + auVar133._28_4_;
            auVar133 = vandps_avx(auVar239,*pauVar21);
            auVar133 = vorps_avx(auVar133,auVar136);
            *pauVar21 = auVar133;
            pauVar21 = pauVar21 + 1;
            iVar23 = iVar23 + 8;
          } while (iVar23 < (int)uVar15);
          uVar18 = local_150._0_4_;
        }
        auVar261._8_4_ = 0x3f800000;
        auVar261._0_8_ = 0x3f8000003f800000;
        auVar261._12_4_ = 0x3f800000;
        auVar290._8_4_ = 0xbf800000;
        auVar290._0_8_ = 0xbf800000bf800000;
        auVar290._12_4_ = 0xbf800000;
        uVar17 = uVar18 | 3;
        while ((int)uVar17 < (int)uVar15) {
          auVar113._8_4_ = 0x7fffffff;
          auVar113._0_8_ = 0x7fffffff7fffffff;
          auVar113._12_4_ = 0x7fffffff;
          auVar110 = vandps_avx(*(undefined1 (*) [16])*pauVar21,auVar113);
          auVar130 = vcmpps_avx(auVar261,auVar110,1);
          auVar141 = vblendvps_avx(auVar110,auVar290,auVar130);
          auVar110 = vmaxps_avx(auVar261,auVar110);
          auVar204 = vrcpps_avx(auVar110);
          fVar26 = auVar141._0_4_ * auVar204._0_4_;
          fVar101 = auVar141._4_4_ * auVar204._4_4_;
          fVar102 = auVar141._8_4_ * auVar204._8_4_;
          fVar104 = auVar141._12_4_ * auVar204._12_4_;
          auVar114._0_4_ = auVar110._0_4_ * fVar26;
          auVar114._4_4_ = auVar110._4_4_ * fVar101;
          auVar114._8_4_ = auVar110._8_4_ * fVar102;
          auVar114._12_4_ = auVar110._12_4_ * fVar104;
          auVar110 = vsubps_avx(auVar141,auVar114);
          fVar26 = fVar26 + auVar204._0_4_ * auVar110._0_4_;
          fVar101 = fVar101 + auVar204._4_4_ * auVar110._4_4_;
          fVar102 = fVar102 + auVar204._8_4_ * auVar110._8_4_;
          fVar104 = fVar104 + auVar204._12_4_ * auVar110._12_4_;
          fVar105 = fVar26 * fVar26;
          fVar106 = fVar101 * fVar101;
          fVar107 = fVar102 * fVar102;
          fVar161 = fVar104 * fVar104;
          fVar172 = fVar105 * fVar105;
          fVar173 = fVar106 * fVar106;
          fVar174 = fVar107 * fVar107;
          fVar175 = fVar161 * fVar161;
          fVar176 = ((fVar172 * -0.01606863 + -0.07504295) * fVar172 + -0.14203644) * fVar172 +
                    -0.33333072;
          fVar177 = ((fVar173 * -0.01606863 + -0.07504295) * fVar173 + -0.14203644) * fVar173 +
                    -0.33333072;
          fVar178 = ((fVar174 * -0.01606863 + -0.07504295) * fVar174 + -0.14203644) * fVar174 +
                    -0.33333072;
          fVar196 = ((fVar175 * -0.01606863 + -0.07504295) * fVar175 + -0.14203644) * fVar175 +
                    -0.33333072;
          in_ZMM5 = ZEXT1664(CONCAT412(fVar196,CONCAT48(fVar178,CONCAT44(fVar177,fVar176))));
          auVar163._8_4_ = 0x3fc90fdb;
          auVar163._0_8_ = 0x3fc90fdb3fc90fdb;
          auVar163._12_4_ = 0x3fc90fdb;
          auVar110 = vandps_avx(auVar130,auVar163);
          auVar115._0_4_ =
               ((((fVar172 * 0.0028498897 + 0.04269152) * fVar172 + 0.10640934) * fVar172 +
                0.1999262) * fVar172 + 1.0 + fVar176 * fVar105) * fVar26 + auVar110._0_4_;
          auVar115._4_4_ =
               ((((fVar173 * 0.0028498897 + 0.04269152) * fVar173 + 0.10640934) * fVar173 +
                0.1999262) * fVar173 + 1.0 + fVar177 * fVar106) * fVar101 + auVar110._4_4_;
          auVar115._8_4_ =
               ((((fVar174 * 0.0028498897 + 0.04269152) * fVar174 + 0.10640934) * fVar174 +
                0.1999262) * fVar174 + 1.0 + fVar178 * fVar107) * fVar102 + auVar110._8_4_;
          auVar115._12_4_ =
               ((((fVar175 * 0.0028498897 + 0.04269152) * fVar175 + 0.10640934) * fVar175 +
                0.1999262) * fVar175 + 1.0 + fVar196 * fVar161) * fVar104 + auVar110._12_4_;
          auVar143._8_4_ = 0x80000000;
          auVar143._0_8_ = 0x8000000080000000;
          auVar143._12_4_ = 0x80000000;
          auVar110 = vandps_avx(*(undefined1 (*) [16])*pauVar21,auVar143);
          auVar110 = vorps_avx(auVar110,auVar115);
          *(undefined1 (*) [16])*pauVar21 = auVar110;
          pauVar21 = (undefined1 (*) [32])(*pauVar21 + 0x10);
          uVar17 = uVar18 + 7;
          uVar18 = uVar18 + 4;
        }
        if (uVar15 - uVar18 != 0 && (int)uVar18 <= (int)uVar15) {
          lVar19 = 0;
          do {
            in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
            fVar26 = atanf(*(float *)(*pauVar21 + lVar19 * 4));
            *(float *)(*pauVar21 + lVar19 * 4) = fVar26;
            lVar19 = lVar19 + 1;
          } while (uVar15 - uVar18 != (int)lVar19);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != local_120._0_8_);
    }
    break;
  case 0xf:
    iVar23 = bottom_top_blob->c;
    if (0 < (long)iVar23) {
      uVar15 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar22 = 0;
      auVar53._8_4_ = 0x3f800000;
      auVar53._0_8_ = 0x3f8000003f800000;
      auVar53._12_4_ = 0x3f800000;
      auVar53._16_4_ = 0x3f800000;
      auVar53._20_4_ = 0x3f800000;
      auVar53._24_4_ = 0x3f800000;
      auVar53._28_4_ = 0x3f800000;
      auVar121._8_4_ = 0x3f800000;
      auVar121._0_8_ = 0x3f8000003f800000;
      auVar121._12_4_ = 0x3f800000;
      auVar186._8_8_ = 0x8000000000000000;
      auVar186._0_8_ = 0x8000000000000000;
      auVar110 = vpcmpeqd_avx(auVar141,auVar141);
      do {
        pauVar21 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar22 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar15 < 8) {
          uVar18 = 0;
        }
        else {
          iVar24 = 7;
          do {
            auVar56 = *pauVar21;
            auVar156 = vrcpps_avx(auVar56);
            fVar26 = auVar156._0_4_;
            fVar101 = auVar156._4_4_;
            auVar6._4_4_ = auVar56._4_4_ * fVar101;
            auVar6._0_4_ = auVar56._0_4_ * fVar26;
            fVar102 = auVar156._8_4_;
            auVar6._8_4_ = auVar56._8_4_ * fVar102;
            fVar104 = auVar156._12_4_;
            auVar6._12_4_ = auVar56._12_4_ * fVar104;
            fVar105 = auVar156._16_4_;
            auVar6._16_4_ = auVar56._16_4_ * fVar105;
            fVar106 = auVar156._20_4_;
            auVar6._20_4_ = auVar56._20_4_ * fVar106;
            fVar107 = auVar156._24_4_;
            auVar6._24_4_ = auVar56._24_4_ * fVar107;
            auVar6._28_4_ = auVar56._28_4_;
            auVar56 = vsubps_avx(auVar53,auVar6);
            auVar229._0_4_ = fVar26 + fVar26 * auVar56._0_4_;
            auVar229._4_4_ = fVar101 + fVar101 * auVar56._4_4_;
            auVar229._8_4_ = fVar102 + fVar102 * auVar56._8_4_;
            auVar229._12_4_ = fVar104 + fVar104 * auVar56._12_4_;
            auVar229._16_4_ = fVar105 + fVar105 * auVar56._16_4_;
            auVar229._20_4_ = fVar106 + fVar106 * auVar56._20_4_;
            auVar229._24_4_ = fVar107 + fVar107 * auVar56._24_4_;
            auVar229._28_4_ = auVar156._28_4_ + auVar56._28_4_;
            *pauVar21 = auVar229;
            pauVar21 = pauVar21 + 1;
            iVar24 = iVar24 + 8;
            uVar18 = uVar15 & 0xfffffff8;
          } while (iVar24 < (int)uVar15);
        }
        uVar17 = uVar18 | 3;
        while ((int)uVar17 < (int)uVar15) {
          auVar141 = *(undefined1 (*) [16])*pauVar21;
          auVar130 = vrcpps_avx(auVar141);
          fVar26 = auVar130._0_4_;
          auVar222._0_4_ = auVar141._0_4_ * fVar26;
          fVar101 = auVar130._4_4_;
          auVar222._4_4_ = auVar141._4_4_ * fVar101;
          fVar102 = auVar130._8_4_;
          auVar222._8_4_ = auVar141._8_4_ * fVar102;
          fVar104 = auVar130._12_4_;
          auVar222._12_4_ = auVar141._12_4_ * fVar104;
          auVar141 = vsubps_avx(auVar121,auVar222);
          auVar223._0_4_ = fVar26 + fVar26 * auVar141._0_4_;
          auVar223._4_4_ = fVar101 + fVar101 * auVar141._4_4_;
          auVar223._8_4_ = fVar102 + fVar102 * auVar141._8_4_;
          auVar223._12_4_ = fVar104 + fVar104 * auVar141._12_4_;
          *(undefined1 (*) [16])*pauVar21 = auVar223;
          pauVar21 = (undefined1 (*) [32])(*pauVar21 + 0x10);
          uVar17 = uVar18 + 7;
          uVar18 = uVar18 + 4;
        }
        if ((int)uVar18 < (int)uVar15) {
          uVar16 = CONCAT44(0,~uVar18 + uVar15);
          auVar224._8_8_ = 0;
          auVar224._0_8_ = uVar16;
          auVar204 = vpshufd_avx(auVar224,0x44);
          auVar141 = vorps_avx(auVar204,auVar186);
          auVar130 = vorps_avx(auVar204,auVar186);
          auVar204 = vorps_avx(auVar204,auVar186);
          uVar25 = 0;
          do {
            auVar267._8_8_ = 0;
            auVar267._0_8_ = uVar25;
            auVar295 = vpshufd_avx(auVar267,0x44);
            auVar282._16_16_ = auVar295;
            auVar282._0_16_ = auVar295;
            auVar56 = vorps_avx(auVar282,auVar133);
            auVar156 = vorps_avx(auVar282,auVar57);
            auVar305._0_8_ = auVar156._16_8_ ^ 0x8000000000000000;
            auVar305._8_4_ = auVar156._24_4_;
            auVar305._12_4_ = auVar156._28_4_ ^ 0x80000000;
            auVar295 = vpcmpgtq_avx(auVar305,auVar141);
            auVar268._0_8_ = auVar156._0_8_ ^ 0x8000000000000000;
            auVar268._8_4_ = auVar156._8_4_;
            auVar268._12_4_ = auVar156._12_4_ ^ 0x80000000;
            auVar36 = vpcmpgtq_avx(auVar268,auVar130);
            auVar295 = vpackssdw_avx(auVar36,auVar295);
            auVar306._0_8_ = auVar56._16_8_ ^ 0x8000000000000000;
            auVar306._8_4_ = auVar56._24_4_;
            auVar306._12_4_ = auVar56._28_4_ ^ 0x80000000;
            auVar36 = vpcmpgtq_avx(auVar306,auVar141);
            auVar293._0_8_ = auVar56._0_8_ ^ 0x8000000000000000;
            auVar293._8_4_ = auVar56._8_4_;
            auVar293._12_4_ = auVar56._12_4_ ^ 0x80000000;
            auVar126 = vpcmpgtq_avx(auVar293,auVar204);
            auVar36 = vpackssdw_avx(auVar126,auVar36);
            auVar295 = vpackssdw_avx(auVar36 ^ auVar110,auVar295 ^ auVar110);
            auVar36 = vpmovsxwd_avx(auVar295);
            auVar295 = vpunpckhwd_avx(auVar295,auVar295);
            auVar283._16_16_ = auVar295;
            auVar283._0_16_ = auVar36;
            auVar156 = vmaskmovps_avx(auVar283,*(undefined1 (*) [32])(*pauVar21 + uVar25 * 4));
            auVar56 = vrcpps_avx(auVar156);
            fVar26 = auVar56._0_4_;
            fVar101 = auVar56._4_4_;
            auVar7._4_4_ = auVar156._4_4_ * fVar101;
            auVar7._0_4_ = auVar156._0_4_ * fVar26;
            fVar102 = auVar56._8_4_;
            auVar7._8_4_ = auVar156._8_4_ * fVar102;
            fVar104 = auVar56._12_4_;
            auVar7._12_4_ = auVar156._12_4_ * fVar104;
            fVar105 = auVar56._16_4_;
            auVar7._16_4_ = auVar156._16_4_ * fVar105;
            fVar106 = auVar56._20_4_;
            auVar7._20_4_ = auVar156._20_4_ * fVar106;
            fVar107 = auVar56._24_4_;
            auVar7._24_4_ = auVar156._24_4_ * fVar107;
            auVar7._28_4_ = auVar156._28_4_;
            auVar156 = vsubps_avx(auVar53,auVar7);
            auVar301._0_4_ = fVar26 + fVar26 * auVar156._0_4_;
            auVar301._4_4_ = fVar101 + fVar101 * auVar156._4_4_;
            auVar301._8_4_ = fVar102 + fVar102 * auVar156._8_4_;
            auVar301._12_4_ = fVar104 + fVar104 * auVar156._12_4_;
            auVar301._16_4_ = fVar105 + fVar105 * auVar156._16_4_;
            auVar301._20_4_ = fVar106 + fVar106 * auVar156._20_4_;
            auVar301._24_4_ = fVar107 + fVar107 * auVar156._24_4_;
            auVar301._28_4_ = auVar56._28_4_ + auVar156._28_4_;
            auVar56 = vmaskmovps_avx(auVar283,auVar301);
            *(undefined1 (*) [32])(*pauVar21 + uVar25 * 4) = auVar56;
            uVar25 = uVar25 + 8;
          } while ((uVar16 + 8 & 0x1fffffff8) != uVar25);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != iVar23);
    }
    break;
  case 0x10:
    local_120._0_8_ = (long)bottom_top_blob->c;
    if (0 < (long)bottom_top_blob->c) {
      uVar15 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      local_150._0_4_ = uVar15 & 0xfffffff8;
      lVar22 = 0;
      do {
        auVar279._8_4_ = 0x3f800000;
        auVar279._0_8_ = 0x3f8000003f800000;
        auVar156._8_4_ = 0xc2b0c0a5;
        auVar156._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar133._8_4_ = 0x42b0c0a5;
        auVar133._0_8_ = 0x42b0c0a542b0c0a5;
        auVar279._12_4_ = 0x3f800000;
        auVar156._12_4_ = 0xc2b0c0a5;
        auVar133._12_4_ = 0x42b0c0a5;
        auVar279._16_4_ = 0x3f800000;
        auVar156._16_4_ = 0xc2b0c0a5;
        auVar133._16_4_ = 0x42b0c0a5;
        auVar279._20_4_ = 0x3f800000;
        auVar156._20_4_ = 0xc2b0c0a5;
        auVar133._20_4_ = 0x42b0c0a5;
        auVar279._24_4_ = 0x3f800000;
        auVar156._24_4_ = 0xc2b0c0a5;
        auVar133._24_4_ = 0x42b0c0a5;
        auVar279._28_4_ = 0x3f800000;
        auVar156._28_4_ = 0xc2b0c0a5;
        auVar133._28_4_ = 0x42b0c0a5;
        pfVar20 = (float *)(local_128->cstep * lVar22 * local_128->elemsize + (long)local_128->data)
        ;
        if ((int)uVar15 < 8) {
          uVar18 = 0;
        }
        else {
          iVar23 = 7;
          do {
            auVar13._4_4_ = pfVar20[1] * -2.0;
            auVar13._0_4_ = *pfVar20 * -2.0;
            auVar13._8_4_ = pfVar20[2] * -2.0;
            auVar13._12_4_ = pfVar20[3] * -2.0;
            auVar13._16_4_ = pfVar20[4] * -2.0;
            auVar13._20_4_ = pfVar20[5] * -2.0;
            auVar13._24_4_ = pfVar20[6] * -2.0;
            auVar13._28_4_ = 0xc0000000;
            auVar57 = vminps_avx(auVar13,auVar133);
            auVar56 = vmaxps_avx(auVar57,auVar156);
            auVar134._0_4_ = auVar56._0_4_ * 1.442695 + 0.5;
            auVar134._4_4_ = auVar56._4_4_ * 1.442695 + 0.5;
            auVar134._8_4_ = auVar56._8_4_ * 1.442695 + 0.5;
            auVar134._12_4_ = auVar56._12_4_ * 1.442695 + 0.5;
            auVar134._16_4_ = auVar56._16_4_ * 1.442695 + 0.5;
            auVar134._20_4_ = auVar56._20_4_ * 1.442695 + 0.5;
            auVar134._24_4_ = auVar56._24_4_ * 1.442695 + 0.5;
            auVar134._28_4_ = 0x42b1c0a5;
            auVar1 = vroundps_avx(auVar134,1);
            auVar57 = vcmpps_avx(auVar134,auVar1,1);
            auVar57 = vandps_avx(auVar279,auVar57);
            auVar57 = vsubps_avx(auVar1,auVar57);
            fVar26 = auVar56._0_4_ + auVar57._0_4_ * -0.6931472;
            fVar101 = auVar56._4_4_ + auVar57._4_4_ * -0.6931472;
            fVar102 = auVar56._8_4_ + auVar57._8_4_ * -0.6931472;
            fVar104 = auVar56._12_4_ + auVar57._12_4_ * -0.6931472;
            fVar105 = auVar56._16_4_ + auVar57._16_4_ * -0.6931472;
            fVar106 = auVar56._20_4_ + auVar57._20_4_ * -0.6931472;
            fVar107 = auVar56._24_4_ + auVar57._24_4_ * -0.6931472;
            auVar109._0_4_ = (int)auVar57._0_4_;
            auVar109._4_4_ = (int)auVar57._4_4_;
            auVar109._8_4_ = (int)auVar57._8_4_;
            auVar109._12_4_ = (int)auVar57._12_4_;
            auVar135._16_4_ = (int)auVar57._16_4_;
            auVar135._0_16_ = auVar109;
            auVar135._20_4_ = (int)auVar57._20_4_;
            auVar135._24_4_ = (int)auVar57._24_4_;
            auVar135._28_4_ = (int)auVar57._28_4_;
            auVar141 = vpslld_avx(auVar109,0x17);
            auVar110 = vpslld_avx(auVar135._16_16_,0x17);
            auVar162._8_4_ = 0x3f800000;
            auVar162._0_8_ = 0x3f8000003f800000;
            auVar162._12_4_ = 0x3f800000;
            auVar110 = vpaddd_avx(auVar110,auVar162);
            auVar141 = vpaddd_avx(auVar141,auVar162);
            auVar48._0_4_ =
                 (fVar26 + 1.0 +
                 fVar26 * fVar26 *
                 (((((fVar26 * 0.00019875691 + 0.0013981999) * fVar26 + 0.008333452) * fVar26 +
                   0.041665796) * fVar26 + 0.16666666) * fVar26 + 0.5)) * auVar141._0_4_ + 1.0;
            auVar48._4_4_ =
                 (fVar101 + 1.0 +
                 fVar101 * fVar101 *
                 (((((fVar101 * 0.00019875691 + 0.0013981999) * fVar101 + 0.008333452) * fVar101 +
                   0.041665796) * fVar101 + 0.16666666) * fVar101 + 0.5)) * auVar141._4_4_ + 1.0;
            auVar48._8_4_ =
                 (fVar102 + 1.0 +
                 fVar102 * fVar102 *
                 (((((fVar102 * 0.00019875691 + 0.0013981999) * fVar102 + 0.008333452) * fVar102 +
                   0.041665796) * fVar102 + 0.16666666) * fVar102 + 0.5)) * auVar141._8_4_ + 1.0;
            auVar48._12_4_ =
                 (fVar104 + 1.0 +
                 fVar104 * fVar104 *
                 (((((fVar104 * 0.00019875691 + 0.0013981999) * fVar104 + 0.008333452) * fVar104 +
                   0.041665796) * fVar104 + 0.16666666) * fVar104 + 0.5)) * auVar141._12_4_ + 1.0;
            auVar48._16_4_ =
                 (fVar105 + 1.0 +
                 fVar105 * fVar105 *
                 (((((fVar105 * 0.00019875691 + 0.0013981999) * fVar105 + 0.008333452) * fVar105 +
                   0.041665796) * fVar105 + 0.16666666) * fVar105 + 0.5)) * auVar110._0_4_ + 1.0;
            auVar48._20_4_ =
                 (fVar106 + 1.0 +
                 fVar106 * fVar106 *
                 (((((fVar106 * 0.00019875691 + 0.0013981999) * fVar106 + 0.008333452) * fVar106 +
                   0.041665796) * fVar106 + 0.16666666) * fVar106 + 0.5)) * auVar110._4_4_ + 1.0;
            auVar48._24_4_ =
                 (fVar107 + 1.0 +
                 fVar107 * fVar107 *
                 (((((fVar107 * 0.00019875691 + 0.0013981999) * fVar107 + 0.008333452) * fVar107 +
                   0.041665796) * fVar107 + 0.16666666) * fVar107 + 0.5)) * auVar110._8_4_ + 1.0;
            auVar48._28_4_ = auVar56._28_4_ + auVar1._28_4_ + 1.0 + auVar1._28_4_ + 1.0;
            auVar57 = vrcpps_avx(auVar48);
            fVar26 = auVar57._0_4_;
            fVar101 = auVar57._4_4_;
            fVar102 = auVar57._8_4_;
            fVar104 = auVar57._12_4_;
            fVar105 = auVar57._16_4_;
            fVar106 = auVar57._20_4_;
            fVar107 = auVar57._24_4_;
            auVar1._4_4_ = auVar48._4_4_ * (fVar101 + fVar101);
            auVar1._0_4_ = auVar48._0_4_ * (fVar26 + fVar26);
            auVar1._8_4_ = auVar48._8_4_ * (fVar102 + fVar102);
            auVar1._12_4_ = auVar48._12_4_ * (fVar104 + fVar104);
            auVar1._16_4_ = auVar48._16_4_ * (fVar105 + fVar105);
            auVar1._20_4_ = auVar48._20_4_ * (fVar106 + fVar106);
            auVar1._24_4_ = auVar48._24_4_ * (fVar107 + fVar107);
            auVar1._28_4_ = auVar48._28_4_;
            auVar168._8_4_ = 0x40000000;
            auVar168._0_8_ = 0x4000000040000000;
            auVar168._12_4_ = 0x40000000;
            auVar168._16_4_ = 0x40000000;
            auVar168._20_4_ = 0x40000000;
            auVar168._24_4_ = 0x40000000;
            auVar168._28_4_ = 0x40000000;
            auVar56 = vsubps_avx(auVar168,auVar1);
            *pfVar20 = fVar26 + fVar26 + -1.0 + fVar26 * auVar56._0_4_;
            pfVar20[1] = fVar101 + fVar101 + -1.0 + fVar101 * auVar56._4_4_;
            pfVar20[2] = fVar102 + fVar102 + -1.0 + fVar102 * auVar56._8_4_;
            pfVar20[3] = fVar104 + fVar104 + -1.0 + fVar104 * auVar56._12_4_;
            pfVar20[4] = fVar105 + fVar105 + -1.0 + fVar105 * auVar56._16_4_;
            pfVar20[5] = fVar106 + fVar106 + -1.0 + fVar106 * auVar56._20_4_;
            pfVar20[6] = fVar107 + fVar107 + -1.0 + fVar107 * auVar56._24_4_;
            pfVar20[7] = auVar57._28_4_ + auVar57._28_4_ + -1.0 + auVar56._28_4_;
            pfVar20 = pfVar20 + 8;
            iVar23 = iVar23 + 8;
          } while (iVar23 < (int)uVar15);
          uVar18 = local_150._0_4_;
        }
        auVar180._8_4_ = 0x3f800000;
        auVar180._0_8_ = 0x3f8000003f800000;
        auVar180._12_4_ = 0x3f800000;
        auVar221._8_4_ = 0x42b0c0a5;
        auVar221._0_8_ = 0x42b0c0a542b0c0a5;
        auVar221._12_4_ = 0x42b0c0a5;
        auVar231._8_4_ = 0xc2b0c0a5;
        auVar231._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar231._12_4_ = 0xc2b0c0a5;
        auVar203._8_4_ = 0x40000000;
        auVar203._0_8_ = 0x4000000040000000;
        auVar203._12_4_ = 0x40000000;
        uVar17 = uVar18 | 3;
        while ((int)uVar17 < (int)uVar15) {
          auVar27._0_4_ = *pfVar20 * -2.0;
          auVar27._4_4_ = pfVar20[1] * -2.0;
          auVar27._8_4_ = pfVar20[2] * -2.0;
          auVar27._12_4_ = pfVar20[3] * -2.0;
          auVar110 = vminps_avx(auVar27,auVar221);
          auVar130 = vmaxps_avx(auVar110,auVar231);
          auVar111._0_4_ = auVar130._0_4_ * 1.442695 + 0.5;
          auVar111._4_4_ = auVar130._4_4_ * 1.442695 + 0.5;
          auVar111._8_4_ = auVar130._8_4_ * 1.442695 + 0.5;
          auVar111._12_4_ = auVar130._12_4_ * 1.442695 + 0.5;
          auVar142._0_4_ = (int)auVar111._0_4_;
          auVar142._4_4_ = (int)auVar111._4_4_;
          auVar142._8_4_ = (int)auVar111._8_4_;
          auVar142._12_4_ = (int)auVar111._12_4_;
          auVar141 = vcvtdq2ps_avx(auVar142);
          auVar110 = vcmpps_avx(auVar111,auVar141,1);
          auVar110 = vandps_avx(auVar110,auVar180);
          auVar110 = vsubps_avx(auVar141,auVar110);
          fVar26 = auVar130._0_4_ + auVar110._0_4_ * -0.6931472;
          fVar101 = auVar130._4_4_ + auVar110._4_4_ * -0.6931472;
          fVar102 = auVar130._8_4_ + auVar110._8_4_ * -0.6931472;
          fVar104 = auVar130._12_4_ + auVar110._12_4_ * -0.6931472;
          auVar112._0_4_ = (int)auVar110._0_4_;
          auVar112._4_4_ = (int)auVar110._4_4_;
          auVar112._8_4_ = (int)auVar110._8_4_;
          auVar112._12_4_ = (int)auVar110._12_4_;
          auVar110 = vpslld_avx(auVar112,0x17);
          auVar110 = vpaddd_avx(auVar110,auVar180);
          auVar28._0_4_ =
               (fVar26 + 1.0 +
               fVar26 * fVar26 *
               (((((fVar26 * 0.00019875691 + 0.0013981999) * fVar26 + 0.008333452) * fVar26 +
                 0.041665796) * fVar26 + 0.16666666) * fVar26 + 0.5)) * auVar110._0_4_ + 1.0;
          auVar28._4_4_ =
               (fVar101 + 1.0 +
               fVar101 * fVar101 *
               (((((fVar101 * 0.00019875691 + 0.0013981999) * fVar101 + 0.008333452) * fVar101 +
                 0.041665796) * fVar101 + 0.16666666) * fVar101 + 0.5)) * auVar110._4_4_ + 1.0;
          auVar28._8_4_ =
               (fVar102 + 1.0 +
               fVar102 * fVar102 *
               (((((fVar102 * 0.00019875691 + 0.0013981999) * fVar102 + 0.008333452) * fVar102 +
                 0.041665796) * fVar102 + 0.16666666) * fVar102 + 0.5)) * auVar110._8_4_ + 1.0;
          auVar28._12_4_ =
               (fVar104 + 1.0 +
               fVar104 * fVar104 *
               (((((fVar104 * 0.00019875691 + 0.0013981999) * fVar104 + 0.008333452) * fVar104 +
                 0.041665796) * fVar104 + 0.16666666) * fVar104 + 0.5)) * auVar110._12_4_ + 1.0;
          auVar110 = vrcpps_avx(auVar28);
          fVar26 = auVar110._0_4_;
          fVar101 = auVar110._4_4_;
          fVar102 = auVar110._8_4_;
          fVar104 = auVar110._12_4_;
          auVar29._0_4_ = auVar28._0_4_ * (fVar26 + fVar26);
          auVar29._4_4_ = auVar28._4_4_ * (fVar101 + fVar101);
          auVar29._8_4_ = auVar28._8_4_ * (fVar102 + fVar102);
          auVar29._12_4_ = auVar28._12_4_ * (fVar104 + fVar104);
          auVar110 = vsubps_avx(auVar203,auVar29);
          *pfVar20 = fVar26 + fVar26 + -1.0 + fVar26 * auVar110._0_4_;
          pfVar20[1] = fVar101 + fVar101 + -1.0 + fVar101 * auVar110._4_4_;
          pfVar20[2] = fVar102 + fVar102 + -1.0 + fVar102 * auVar110._8_4_;
          pfVar20[3] = fVar104 + fVar104 + -1.0 + fVar104 * auVar110._12_4_;
          pfVar20 = pfVar20 + 4;
          uVar17 = uVar18 + 7;
          uVar18 = uVar18 + 4;
        }
        if (uVar15 - uVar18 != 0 && (int)uVar18 <= (int)uVar15) {
          lVar19 = 0;
          do {
            fVar26 = tanhf(pfVar20[lVar19]);
            pfVar20[lVar19] = fVar26;
            lVar19 = lVar19 + 1;
          } while (uVar15 - uVar18 != (int)lVar19);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != local_120._0_8_);
    }
    break;
  case 0x11:
    local_130 = (ulong)bottom_top_blob->c;
    if (0 < (long)local_130) {
      iVar23 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      local_138 = 0;
      local_f0._8_8_ = 0x8000000000000000;
      local_f0._0_8_ = 0x8000000000000000;
      do {
        pfVar20 = (float *)(local_128->cstep * local_138 * local_128->elemsize +
                           (long)local_128->data);
        if (iVar23 < 8) {
          uVar15 = 0;
        }
        else {
          uVar18 = 0;
          do {
            local_c0 = *(undefined1 (*) [32])pfVar20;
            UnaryOp_x86_avx_functor::unary_op_log10::func_pack8
                      ((unary_op_log10 *)&local_161,(__m256 *)local_c0);
            *(undefined1 (*) [32])pfVar20 = local_c0;
            pfVar20 = pfVar20 + 8;
            uVar15 = uVar18 + 8;
            iVar24 = uVar18 + 0xf;
            uVar18 = uVar15;
          } while (iVar24 < iVar23);
        }
        auVar141._8_4_ = 0x3f000000;
        auVar141._0_8_ = 0x3f0000003f000000;
        auVar141._12_4_ = 0x3f000000;
        auVar130._8_4_ = 0xffffff82;
        auVar130._0_8_ = 0xffffff82ffffff82;
        auVar130._12_4_ = 0xffffff82;
        auVar204._8_4_ = 0x3f3504f3;
        auVar204._0_8_ = 0x3f3504f33f3504f3;
        auVar204._12_4_ = 0x3f3504f3;
        auVar295._8_4_ = 0x3f800000;
        auVar295._0_8_ = 0x3f8000003f800000;
        auVar295._12_4_ = 0x3f800000;
        auVar110._8_4_ = 0x3e4cceac;
        auVar110._0_8_ = 0x3e4cceac3e4cceac;
        auVar110._12_4_ = 0x3e4cceac;
        uVar18 = uVar15 | 3;
        while ((int)uVar18 < iVar23) {
          auVar36._8_4_ = 0x800000;
          auVar36._0_8_ = 0x80000000800000;
          auVar36._12_4_ = 0x800000;
          auVar36 = vmaxps_avx(auVar36,*(undefined1 (*) [16])pfVar20);
          auVar126 = vpsrld_avx(auVar36,0x17);
          auVar126 = vpaddd_avx(auVar126,auVar130);
          auVar151._8_4_ = 0x807fffff;
          auVar151._0_8_ = 0x807fffff807fffff;
          auVar151._12_4_ = 0x807fffff;
          auVar36 = vandps_avx(auVar36,auVar151);
          auVar37 = vorps_avx(auVar36,auVar141);
          auVar151 = vcvtdq2ps_avx(auVar126);
          auVar126 = vcmpps_avx(auVar37,auVar204,1);
          auVar36 = vandps_avx(auVar126,auVar37);
          fVar26 = auVar37._0_4_ + -1.0 + auVar36._0_4_;
          fVar101 = auVar37._4_4_ + -1.0 + auVar36._4_4_;
          fVar102 = auVar37._8_4_ + -1.0 + auVar36._8_4_;
          fVar104 = auVar37._12_4_ + -1.0 + auVar36._12_4_;
          auVar36 = vandps_avx(auVar295,auVar126);
          auVar36 = vsubps_avx(auVar151,auVar36);
          auVar126._0_4_ =
               (auVar36._0_4_ * 0.6931472 + fVar26 +
               fVar26 * fVar26 *
               (((((((((fVar26 * 0.070376836 + -0.1151461) * fVar26 + 0.116769984) * fVar26 +
                     -0.12420141) * fVar26 + 0.14249323) * fVar26 + -0.16668057) * fVar26 +
                  0.20000714) * fVar26 + -0.24999994) * fVar26 + 0.3333333) * fVar26 + -0.5)) *
               0.4342945;
          auVar126._4_4_ =
               (auVar36._4_4_ * 0.6931472 + fVar101 +
               fVar101 * fVar101 *
               (((((((((fVar101 * 0.070376836 + -0.1151461) * fVar101 + 0.116769984) * fVar101 +
                     -0.12420141) * fVar101 + 0.14249323) * fVar101 + -0.16668057) * fVar101 +
                  0.20000714) * fVar101 + -0.24999994) * fVar101 + 0.3333333) * fVar101 + -0.5)) *
               0.4342945;
          auVar126._8_4_ =
               (auVar36._8_4_ * 0.6931472 + fVar102 +
               fVar102 * fVar102 *
               (((((((((fVar102 * 0.070376836 + -0.1151461) * fVar102 + 0.116769984) * fVar102 +
                     -0.12420141) * fVar102 + 0.14249323) * fVar102 + -0.16668057) * fVar102 +
                  0.20000714) * fVar102 + -0.24999994) * fVar102 + 0.3333333) * fVar102 + -0.5)) *
               0.4342945;
          auVar126._12_4_ =
               (auVar36._12_4_ * 0.6931472 + fVar104 +
               fVar104 * fVar104 *
               (((((((((fVar104 * 0.070376836 + -0.1151461) * fVar104 + 0.116769984) * fVar104 +
                     -0.12420141) * fVar104 + 0.14249323) * fVar104 + -0.16668057) * fVar104 +
                  0.20000714) * fVar104 + -0.24999994) * fVar104 + 0.3333333) * fVar104 + -0.5)) *
               0.4342945;
          *(undefined1 (*) [16])pfVar20 = auVar126;
          pfVar20 = pfVar20 + 4;
          uVar18 = uVar15 + 7;
          uVar15 = uVar15 + 4;
        }
        auVar110 = vpcmpeqd_avx(auVar110,auVar110);
        if ((int)uVar15 < iVar23) {
          uVar16 = CONCAT44(0,~uVar15 + iVar23);
          auVar37._8_8_ = 0;
          auVar37._0_8_ = uVar16;
          auVar141 = vpshufd_avx(auVar37,0x44);
          local_a0._16_16_ = auVar141;
          local_a0._0_16_ = auVar141;
          local_d0 = vpor_avx(auVar141,local_f0);
          local_e0 = vpor_avx(auVar141,local_f0);
          uVar25 = 0;
          auVar133 = _DAT_00594ae0;
          do {
            auVar38._8_8_ = 0;
            auVar38._0_8_ = uVar25;
            auVar141 = vpshufd_avx(auVar38,0x44);
            auVar56._16_16_ = auVar141;
            auVar56._0_16_ = auVar141;
            auVar57 = vorps_avx(auVar56,_DAT_00594ac0);
            auVar133 = vorps_avx(auVar56,auVar133);
            auVar204 = vpor_avx(local_a0._16_16_,local_f0);
            auVar141 = vpcmpgtq_avx(auVar133._16_16_ ^ local_f0,auVar204);
            auVar130 = vpcmpgtq_avx(auVar133._0_16_ ^ local_f0,local_d0);
            auVar141 = vpackssdw_avx(auVar130,auVar141);
            auVar130 = vpcmpgtq_avx(auVar57._16_16_ ^ local_f0,auVar204);
            auVar127._0_4_ = auVar57._0_4_ ^ local_f0._0_4_;
            auVar127._4_4_ = auVar57._4_4_ ^ local_f0._4_4_;
            auVar127._8_4_ = auVar57._8_4_ ^ local_f0._8_4_;
            auVar127._12_4_ = auVar57._12_4_ ^ local_f0._12_4_;
            auVar204 = vpcmpgtq_avx(auVar127,local_e0);
            auVar130 = vpackssdw_avx(auVar204,auVar130);
            auVar141 = vpackssdw_avx(auVar130 ^ auVar110,auVar141 ^ auVar110);
            auVar130 = vpmovsxwd_avx(auVar141);
            auVar141 = vpunpckhwd_avx(auVar141,auVar141);
            local_80._16_16_ = auVar141;
            local_80._0_16_ = auVar130;
            local_120 = vmaskmovps_avx(local_80,*(undefined1 (*) [32])(pfVar20 + uVar25));
            local_150 = local_120._16_16_;
            local_160._0_4_ = log10f(local_120._16_4_);
            local_160._4_4_ = extraout_XMM0_Db_05;
            local_160._8_4_ = extraout_XMM0_Dc_05;
            local_160._12_4_ = extraout_XMM0_Dd_05;
            auVar141 = vmovshdup_avx(local_150);
            auVar83._0_4_ = log10f(auVar141._0_4_);
            auVar83._4_60_ = extraout_var_17;
            local_160 = vinsertps_avx(local_160,auVar83._0_16_,0x10);
            auVar141 = vpermilpd_avx(local_150,1);
            auVar84._0_4_ = log10f(auVar141._0_4_);
            auVar84._4_60_ = extraout_var_18;
            local_160 = vinsertps_avx(local_160,auVar84._0_16_,0x20);
            auVar141 = vpermilps_avx(local_150,0xff);
            auVar85._0_4_ = log10f(auVar141._0_4_);
            auVar85._4_60_ = extraout_var_19;
            local_150 = vinsertps_avx(local_160,auVar85._0_16_,0x30);
            local_160._0_4_ = log10f((float)local_120._0_4_);
            local_160._4_4_ = extraout_XMM0_Db_06;
            local_160._8_4_ = extraout_XMM0_Dc_06;
            local_160._12_4_ = extraout_XMM0_Dd_06;
            auVar141 = vmovshdup_avx(local_120._0_16_);
            auVar86._0_4_ = log10f(auVar141._0_4_);
            auVar86._4_60_ = extraout_var_20;
            local_160 = vinsertps_avx(local_160,auVar86._0_16_,0x10);
            auVar141 = vpermilpd_avx(local_120._0_16_,1);
            auVar87._0_4_ = log10f(auVar141._0_4_);
            auVar87._4_60_ = extraout_var_21;
            local_160 = vinsertps_avx(local_160,auVar87._0_16_,0x20);
            auVar141 = vpermilps_avx(local_120._0_16_,0xff);
            auVar88._0_4_ = log10f(auVar141._0_4_);
            auVar133 = _DAT_00594ae0;
            auVar88._4_60_ = extraout_var_22;
            auVar110 = vpcmpeqd_avx(auVar110,auVar110);
            auVar141 = vinsertps_avx(local_160,auVar88._0_16_,0x30);
            auVar57._16_16_ = local_150;
            auVar57._0_16_ = auVar141;
            auVar57 = vmaskmovps_avx(local_80,auVar57);
            *(undefined1 (*) [32])(pfVar20 + uVar25) = auVar57;
            uVar25 = uVar25 + 8;
          } while ((uVar16 + 8 & 0x1fffffff8) != uVar25);
        }
        local_138 = local_138 + 1;
      } while (local_138 != local_130);
    }
  }
  return 0;
}

Assistant:

int UnaryOp_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    using namespace UnaryOp_x86_avx_functor;
    if (op_type == Operation_ABS)
        return unary_op_inplace<unary_op_abs>(bottom_top_blob, opt);

    if (op_type == Operation_NEG)
        return unary_op_inplace<unary_op_neg>(bottom_top_blob, opt);

    if (op_type == Operation_FLOOR)
        return unary_op_inplace<unary_op_floor>(bottom_top_blob, opt);

    if (op_type == Operation_CEIL)
        return unary_op_inplace<unary_op_ceil>(bottom_top_blob, opt);

    if (op_type == Operation_SQUARE)
        return unary_op_inplace<unary_op_square>(bottom_top_blob, opt);

    if (op_type == Operation_SQRT)
        return unary_op_inplace<unary_op_sqrt>(bottom_top_blob, opt);

    if (op_type == Operation_RSQRT)
        return unary_op_inplace<unary_op_rsqrt>(bottom_top_blob, opt);

    if (op_type == Operation_EXP)
        return unary_op_inplace<unary_op_exp>(bottom_top_blob, opt);

    if (op_type == Operation_LOG)
        return unary_op_inplace<unary_op_log>(bottom_top_blob, opt);

    if (op_type == Operation_SIN)
        return unary_op_inplace<unary_op_sin>(bottom_top_blob, opt);

    if (op_type == Operation_COS)
        return unary_op_inplace<unary_op_cos>(bottom_top_blob, opt);

    if (op_type == Operation_TAN)
        return unary_op_inplace<unary_op_tan>(bottom_top_blob, opt);

    if (op_type == Operation_ASIN)
        return unary_op_inplace<unary_op_asin>(bottom_top_blob, opt);

    if (op_type == Operation_ACOS)
        return unary_op_inplace<unary_op_acos>(bottom_top_blob, opt);

    if (op_type == Operation_ATAN)
        return unary_op_inplace<unary_op_atan>(bottom_top_blob, opt);

    if (op_type == Operation_RECIPROCAL)
        return unary_op_inplace<unary_op_reciprocal>(bottom_top_blob, opt);

    if (op_type == Operation_TANH)
        return unary_op_inplace<unary_op_tanh>(bottom_top_blob, opt);

    if (op_type == Operation_LOG10)
        return unary_op_inplace<unary_op_log10>(bottom_top_blob, opt);

    return 0;
}